

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O1

void idct64_low32_avx2(__m256i *input,__m256i *output)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  
  auVar30._8_2_ = 0x328;
  auVar30._0_8_ = 0x328032803280328;
  auVar30._10_2_ = 0x328;
  auVar30._12_2_ = 0x328;
  auVar30._14_2_ = 0x328;
  auVar30._16_2_ = 0x328;
  auVar30._18_2_ = 0x328;
  auVar30._20_2_ = 0x328;
  auVar30._22_2_ = 0x328;
  auVar30._24_2_ = 0x328;
  auVar30._26_2_ = 0x328;
  auVar30._28_2_ = 0x328;
  auVar30._30_2_ = 0x328;
  auVar75._8_2_ = 0x7ff8;
  auVar75._0_8_ = 0x7ff87ff87ff87ff8;
  auVar75._10_2_ = 0x7ff8;
  auVar75._12_2_ = 0x7ff8;
  auVar75._14_2_ = 0x7ff8;
  auVar75._16_2_ = 0x7ff8;
  auVar75._18_2_ = 0x7ff8;
  auVar75._20_2_ = 0x7ff8;
  auVar75._22_2_ = 0x7ff8;
  auVar75._24_2_ = 0x7ff8;
  auVar75._26_2_ = 0x7ff8;
  auVar75._28_2_ = 0x7ff8;
  auVar75._30_2_ = 0x7ff8;
  auVar29 = vpmulhrsw_avx2((undefined1  [32])input[1],auVar30);
  auVar30 = vpmulhrsw_avx2((undefined1  [32])input[1],auVar75);
  auVar31._8_2_ = 0xa7c0;
  auVar31._0_8_ = 0xa7c0a7c0a7c0a7c0;
  auVar31._10_2_ = 0xa7c0;
  auVar31._12_2_ = 0xa7c0;
  auVar31._14_2_ = 0xa7c0;
  auVar31._16_2_ = 0xa7c0;
  auVar31._18_2_ = 0xa7c0;
  auVar31._20_2_ = 0xa7c0;
  auVar31._22_2_ = 0xa7c0;
  auVar31._24_2_ = 0xa7c0;
  auVar31._26_2_ = 0xa7c0;
  auVar31._28_2_ = 0xa7c0;
  auVar31._30_2_ = 0xa7c0;
  auVar72._8_2_ = 0x5cb8;
  auVar72._0_8_ = 0x5cb85cb85cb85cb8;
  auVar72._10_2_ = 0x5cb8;
  auVar72._12_2_ = 0x5cb8;
  auVar72._14_2_ = 0x5cb8;
  auVar72._16_2_ = 0x5cb8;
  auVar72._18_2_ = 0x5cb8;
  auVar72._20_2_ = 0x5cb8;
  auVar72._22_2_ = 0x5cb8;
  auVar72._24_2_ = 0x5cb8;
  auVar72._26_2_ = 0x5cb8;
  auVar72._28_2_ = 0x5cb8;
  auVar72._30_2_ = 0x5cb8;
  auVar45 = vpmulhrsw_avx2((undefined1  [32])input[0x1f],auVar31);
  auVar51 = vpmulhrsw_avx2((undefined1  [32])input[0x1f],auVar72);
  auVar62._8_2_ = 0x33e0;
  auVar62._0_8_ = 0x33e033e033e033e0;
  auVar62._10_2_ = 0x33e0;
  auVar62._12_2_ = 0x33e0;
  auVar62._14_2_ = 0x33e0;
  auVar62._16_2_ = 0x33e0;
  auVar62._18_2_ = 0x33e0;
  auVar62._20_2_ = 0x33e0;
  auVar62._22_2_ = 0x33e0;
  auVar62._24_2_ = 0x33e0;
  auVar62._26_2_ = 0x33e0;
  auVar62._28_2_ = 0x33e0;
  auVar62._30_2_ = 0x33e0;
  auVar68._8_2_ = 0x7508;
  auVar68._0_8_ = 0x7508750875087508;
  auVar68._10_2_ = 0x7508;
  auVar68._12_2_ = 0x7508;
  auVar68._14_2_ = 0x7508;
  auVar68._16_2_ = 0x7508;
  auVar68._18_2_ = 0x7508;
  auVar68._20_2_ = 0x7508;
  auVar68._22_2_ = 0x7508;
  auVar68._24_2_ = 0x7508;
  auVar68._26_2_ = 0x7508;
  auVar68._28_2_ = 0x7508;
  auVar68._30_2_ = 0x7508;
  auVar32 = vpmulhrsw_avx2((undefined1  [32])input[0x11],auVar62);
  auVar31 = vpmulhrsw_avx2((undefined1  [32])input[0x11],auVar68);
  auVar33._8_2_ = 0xd1f0;
  auVar33._0_8_ = 0xd1f0d1f0d1f0d1f0;
  auVar33._10_2_ = 0xd1f0;
  auVar33._12_2_ = 0xd1f0;
  auVar33._14_2_ = 0xd1f0;
  auVar33._16_2_ = 0xd1f0;
  auVar33._18_2_ = 0xd1f0;
  auVar33._20_2_ = 0xd1f0;
  auVar33._22_2_ = 0xd1f0;
  auVar33._24_2_ = 0xd1f0;
  auVar33._26_2_ = 0xd1f0;
  auVar33._28_2_ = 0xd1f0;
  auVar33._30_2_ = 0xd1f0;
  auVar63._8_2_ = 0x7770;
  auVar63._0_8_ = 0x7770777077707770;
  auVar63._10_2_ = 0x7770;
  auVar63._12_2_ = 0x7770;
  auVar63._14_2_ = 0x7770;
  auVar63._16_2_ = 0x7770;
  auVar63._18_2_ = 0x7770;
  auVar63._20_2_ = 0x7770;
  auVar63._22_2_ = 0x7770;
  auVar63._24_2_ = 0x7770;
  auVar63._26_2_ = 0x7770;
  auVar63._28_2_ = 0x7770;
  auVar63._30_2_ = 0x7770;
  auVar33 = vpmulhrsw_avx2((undefined1  [32])input[0xf],auVar33);
  auVar50 = vpmulhrsw_avx2((undefined1  [32])input[0xf],auVar63);
  auVar34._8_2_ = 0x1c08;
  auVar34._0_8_ = 0x1c081c081c081c08;
  auVar34._10_2_ = 0x1c08;
  auVar34._12_2_ = 0x1c08;
  auVar34._14_2_ = 0x1c08;
  auVar34._16_2_ = 0x1c08;
  auVar34._18_2_ = 0x1c08;
  auVar34._20_2_ = 0x1c08;
  auVar34._22_2_ = 0x1c08;
  auVar34._24_2_ = 0x1c08;
  auVar34._26_2_ = 0x1c08;
  auVar34._28_2_ = 0x1c08;
  auVar34._30_2_ = 0x1c08;
  auVar64._8_2_ = 0x7ce0;
  auVar64._0_8_ = 0x7ce07ce07ce07ce0;
  auVar64._10_2_ = 0x7ce0;
  auVar64._12_2_ = 0x7ce0;
  auVar64._14_2_ = 0x7ce0;
  auVar64._16_2_ = 0x7ce0;
  auVar64._18_2_ = 0x7ce0;
  auVar64._20_2_ = 0x7ce0;
  auVar64._22_2_ = 0x7ce0;
  auVar64._24_2_ = 0x7ce0;
  auVar64._26_2_ = 0x7ce0;
  auVar64._28_2_ = 0x7ce0;
  auVar64._30_2_ = 0x7ce0;
  auVar34 = vpmulhrsw_avx2((undefined1  [32])input[9],auVar34);
  auVar64 = vpmulhrsw_avx2((undefined1  [32])input[9],auVar64);
  auVar35._8_2_ = 0xbb88;
  auVar35._0_8_ = 0xbb88bb88bb88bb88;
  auVar35._10_2_ = 0xbb88;
  auVar35._12_2_ = 0xbb88;
  auVar35._14_2_ = 0xbb88;
  auVar35._16_2_ = 0xbb88;
  auVar35._18_2_ = 0xbb88;
  auVar35._20_2_ = 0xbb88;
  auVar35._22_2_ = 0xbb88;
  auVar35._24_2_ = 0xbb88;
  auVar35._26_2_ = 0xbb88;
  auVar35._28_2_ = 0xbb88;
  auVar35._30_2_ = 0xbb88;
  auVar43._8_2_ = 0x6c28;
  auVar43._0_8_ = 0x6c286c286c286c28;
  auVar43._10_2_ = 0x6c28;
  auVar43._12_2_ = 0x6c28;
  auVar43._14_2_ = 0x6c28;
  auVar43._16_2_ = 0x6c28;
  auVar43._18_2_ = 0x6c28;
  auVar43._20_2_ = 0x6c28;
  auVar43._22_2_ = 0x6c28;
  auVar43._24_2_ = 0x6c28;
  auVar43._26_2_ = 0x6c28;
  auVar43._28_2_ = 0x6c28;
  auVar43._30_2_ = 0x6c28;
  auVar35 = vpmulhrsw_avx2((undefined1  [32])input[0x17],auVar35);
  auVar56 = vpmulhrsw_avx2((undefined1  [32])input[0x17],auVar43);
  auVar36._8_2_ = 0x49b8;
  auVar36._0_8_ = 0x49b849b849b849b8;
  auVar36._10_2_ = 0x49b8;
  auVar36._12_2_ = 0x49b8;
  auVar36._14_2_ = 0x49b8;
  auVar36._16_2_ = 0x49b8;
  auVar36._18_2_ = 0x49b8;
  auVar36._20_2_ = 0x49b8;
  auVar36._22_2_ = 0x49b8;
  auVar36._24_2_ = 0x49b8;
  auVar36._26_2_ = 0x49b8;
  auVar36._28_2_ = 0x49b8;
  auVar36._30_2_ = 0x49b8;
  auVar65._8_2_ = 0x68a8;
  auVar65._0_8_ = 0x68a868a868a868a8;
  auVar65._10_2_ = 0x68a8;
  auVar65._12_2_ = 0x68a8;
  auVar65._14_2_ = 0x68a8;
  auVar65._16_2_ = 0x68a8;
  auVar65._18_2_ = 0x68a8;
  auVar65._20_2_ = 0x68a8;
  auVar65._22_2_ = 0x68a8;
  auVar65._24_2_ = 0x68a8;
  auVar65._26_2_ = 0x68a8;
  auVar65._28_2_ = 0x68a8;
  auVar65._30_2_ = 0x68a8;
  auVar36 = vpmulhrsw_avx2((undefined1  [32])input[0x19],auVar36);
  auVar65 = vpmulhrsw_avx2((undefined1  [32])input[0x19],auVar65);
  auVar37._8_2_ = 0xea20;
  auVar37._0_8_ = 0xea20ea20ea20ea20;
  auVar37._10_2_ = 0xea20;
  auVar37._12_2_ = 0xea20;
  auVar37._14_2_ = 0xea20;
  auVar37._16_2_ = 0xea20;
  auVar37._18_2_ = 0xea20;
  auVar37._20_2_ = 0xea20;
  auVar37._22_2_ = 0xea20;
  auVar37._24_2_ = 0xea20;
  auVar37._26_2_ = 0xea20;
  auVar37._28_2_ = 0xea20;
  auVar37._30_2_ = 0xea20;
  auVar59._8_2_ = 0x7e20;
  auVar59._0_8_ = 0x7e207e207e207e20;
  auVar59._10_2_ = 0x7e20;
  auVar59._12_2_ = 0x7e20;
  auVar59._14_2_ = 0x7e20;
  auVar59._16_2_ = 0x7e20;
  auVar59._18_2_ = 0x7e20;
  auVar59._20_2_ = 0x7e20;
  auVar59._22_2_ = 0x7e20;
  auVar59._24_2_ = 0x7e20;
  auVar59._26_2_ = 0x7e20;
  auVar59._28_2_ = 0x7e20;
  auVar59._30_2_ = 0x7e20;
  auVar37 = vpmulhrsw_avx2((undefined1  [32])input[7],auVar37);
  auVar59 = vpmulhrsw_avx2((undefined1  [32])input[7],auVar59);
  auVar38._8_2_ = 0xfa8;
  auVar38._0_8_ = 0xfa80fa80fa80fa8;
  auVar38._10_2_ = 0xfa8;
  auVar38._12_2_ = 0xfa8;
  auVar38._14_2_ = 0xfa8;
  auVar38._16_2_ = 0xfa8;
  auVar38._18_2_ = 0xfa8;
  auVar38._20_2_ = 0xfa8;
  auVar38._22_2_ = 0xfa8;
  auVar38._24_2_ = 0xfa8;
  auVar38._26_2_ = 0xfa8;
  auVar38._28_2_ = 0xfa8;
  auVar38._30_2_ = 0xfa8;
  auVar66._8_2_ = 0x7f08;
  auVar66._0_8_ = 0x7f087f087f087f08;
  auVar66._10_2_ = 0x7f08;
  auVar66._12_2_ = 0x7f08;
  auVar66._14_2_ = 0x7f08;
  auVar66._16_2_ = 0x7f08;
  auVar66._18_2_ = 0x7f08;
  auVar66._20_2_ = 0x7f08;
  auVar66._22_2_ = 0x7f08;
  auVar66._24_2_ = 0x7f08;
  auVar66._26_2_ = 0x7f08;
  auVar66._28_2_ = 0x7f08;
  auVar66._30_2_ = 0x7f08;
  auVar38 = vpmulhrsw_avx2((undefined1  [32])input[5],auVar38);
  auVar66 = vpmulhrsw_avx2((undefined1  [32])input[5],auVar66);
  auVar69._8_2_ = 0xb140;
  auVar69._0_8_ = 0xb140b140b140b140;
  auVar69._10_2_ = 0xb140;
  auVar69._12_2_ = 0xb140;
  auVar69._14_2_ = 0xb140;
  auVar69._16_2_ = 0xb140;
  auVar69._18_2_ = 0xb140;
  auVar69._20_2_ = 0xb140;
  auVar69._22_2_ = 0xb140;
  auVar69._24_2_ = 0xb140;
  auVar69._26_2_ = 0xb140;
  auVar69._28_2_ = 0xb140;
  auVar69._30_2_ = 0xb140;
  auVar76._8_2_ = 0x64e8;
  auVar76._0_8_ = 0x64e864e864e864e8;
  auVar76._10_2_ = 0x64e8;
  auVar76._12_2_ = 0x64e8;
  auVar76._14_2_ = 0x64e8;
  auVar76._16_2_ = 0x64e8;
  auVar76._18_2_ = 0x64e8;
  auVar76._20_2_ = 0x64e8;
  auVar76._22_2_ = 0x64e8;
  auVar76._24_2_ = 0x64e8;
  auVar76._26_2_ = 0x64e8;
  auVar76._28_2_ = 0x64e8;
  auVar76._30_2_ = 0x64e8;
  auVar69 = vpmulhrsw_avx2((undefined1  [32])input[0x1b],auVar69);
  auVar76 = vpmulhrsw_avx2((undefined1  [32])input[0x1b],auVar76);
  auVar70._8_2_ = 0x3f18;
  auVar70._0_8_ = 0x3f183f183f183f18;
  auVar70._10_2_ = 0x3f18;
  auVar70._12_2_ = 0x3f18;
  auVar70._14_2_ = 0x3f18;
  auVar70._16_2_ = 0x3f18;
  auVar70._18_2_ = 0x3f18;
  auVar70._20_2_ = 0x3f18;
  auVar70._22_2_ = 0x3f18;
  auVar70._24_2_ = 0x3f18;
  auVar70._26_2_ = 0x3f18;
  auVar70._28_2_ = 0x3f18;
  auVar70._30_2_ = 0x3f18;
  auVar81._8_2_ = 0x6f60;
  auVar81._0_8_ = 0x6f606f606f606f60;
  auVar81._10_2_ = 0x6f60;
  auVar81._12_2_ = 0x6f60;
  auVar81._14_2_ = 0x6f60;
  auVar81._16_2_ = 0x6f60;
  auVar81._18_2_ = 0x6f60;
  auVar81._20_2_ = 0x6f60;
  auVar81._22_2_ = 0x6f60;
  auVar81._24_2_ = 0x6f60;
  auVar81._26_2_ = 0x6f60;
  auVar81._28_2_ = 0x6f60;
  auVar81._30_2_ = 0x6f60;
  auVar70 = vpmulhrsw_avx2((undefined1  [32])input[0x15],auVar70);
  auVar81 = vpmulhrsw_avx2((undefined1  [32])input[0x15],auVar81);
  auVar73._8_2_ = 0xdde0;
  auVar73._0_8_ = 0xdde0dde0dde0dde0;
  auVar73._10_2_ = 0xdde0;
  auVar73._12_2_ = 0xdde0;
  auVar73._14_2_ = 0xdde0;
  auVar73._16_2_ = 0xdde0;
  auVar73._18_2_ = 0xdde0;
  auVar73._20_2_ = 0xdde0;
  auVar73._22_2_ = 0xdde0;
  auVar73._24_2_ = 0xdde0;
  auVar73._26_2_ = 0xdde0;
  auVar73._28_2_ = 0xdde0;
  auVar73._30_2_ = 0xdde0;
  auVar88._8_2_ = 0x7b60;
  auVar88._0_8_ = 0x7b607b607b607b60;
  auVar88._10_2_ = 0x7b60;
  auVar88._12_2_ = 0x7b60;
  auVar88._14_2_ = 0x7b60;
  auVar88._16_2_ = 0x7b60;
  auVar88._18_2_ = 0x7b60;
  auVar88._20_2_ = 0x7b60;
  auVar88._22_2_ = 0x7b60;
  auVar88._24_2_ = 0x7b60;
  auVar88._26_2_ = 0x7b60;
  auVar88._28_2_ = 0x7b60;
  auVar88._30_2_ = 0x7b60;
  auVar73 = vpmulhrsw_avx2((undefined1  [32])input[0xb],auVar73);
  auVar88 = vpmulhrsw_avx2((undefined1  [32])input[0xb],auVar88);
  auVar77._8_2_ = 0x2828;
  auVar77._0_8_ = 0x2828282828282828;
  auVar77._10_2_ = 0x2828;
  auVar77._12_2_ = 0x2828;
  auVar77._14_2_ = 0x2828;
  auVar77._16_2_ = 0x2828;
  auVar77._18_2_ = 0x2828;
  auVar77._20_2_ = 0x2828;
  auVar77._22_2_ = 0x2828;
  auVar77._24_2_ = 0x2828;
  auVar77._26_2_ = 0x2828;
  auVar77._28_2_ = 0x2828;
  auVar77._30_2_ = 0x2828;
  auVar13._8_2_ = 0x7988;
  auVar13._0_8_ = 0x7988798879887988;
  auVar13._10_2_ = 0x7988;
  auVar13._12_2_ = 0x7988;
  auVar13._14_2_ = 0x7988;
  auVar13._16_2_ = 0x7988;
  auVar13._18_2_ = 0x7988;
  auVar13._20_2_ = 0x7988;
  auVar13._22_2_ = 0x7988;
  auVar13._24_2_ = 0x7988;
  auVar13._26_2_ = 0x7988;
  auVar13._28_2_ = 0x7988;
  auVar13._30_2_ = 0x7988;
  auVar77 = vpmulhrsw_avx2((undefined1  [32])input[0xd],auVar77);
  auVar43 = vpmulhrsw_avx2((undefined1  [32])input[0xd],auVar13);
  auVar82._8_2_ = 0xc670;
  auVar82._0_8_ = 0xc670c670c670c670;
  auVar82._10_2_ = 0xc670;
  auVar82._12_2_ = 0xc670;
  auVar82._14_2_ = 0xc670;
  auVar82._16_2_ = 0xc670;
  auVar82._18_2_ = 0xc670;
  auVar82._20_2_ = 0xc670;
  auVar82._22_2_ = 0xc670;
  auVar82._24_2_ = 0xc670;
  auVar82._26_2_ = 0xc670;
  auVar82._28_2_ = 0xc670;
  auVar82._30_2_ = 0xc670;
  auVar14._8_2_ = 0x7258;
  auVar14._0_8_ = 0x7258725872587258;
  auVar14._10_2_ = 0x7258;
  auVar14._12_2_ = 0x7258;
  auVar14._14_2_ = 0x7258;
  auVar14._16_2_ = 0x7258;
  auVar14._18_2_ = 0x7258;
  auVar14._20_2_ = 0x7258;
  auVar14._22_2_ = 0x7258;
  auVar14._24_2_ = 0x7258;
  auVar14._26_2_ = 0x7258;
  auVar14._28_2_ = 0x7258;
  auVar14._30_2_ = 0x7258;
  auVar13 = vpmulhrsw_avx2((undefined1  [32])input[0x13],auVar82);
  auVar62 = vpmulhrsw_avx2((undefined1  [32])input[0x13],auVar14);
  auVar71._8_2_ = 0x5398;
  auVar71._0_8_ = 0x5398539853985398;
  auVar71._10_2_ = 0x5398;
  auVar71._12_2_ = 0x5398;
  auVar71._14_2_ = 0x5398;
  auVar71._16_2_ = 0x5398;
  auVar71._18_2_ = 0x5398;
  auVar71._20_2_ = 0x5398;
  auVar71._22_2_ = 0x5398;
  auVar71._24_2_ = 0x5398;
  auVar71._26_2_ = 0x5398;
  auVar71._28_2_ = 0x5398;
  auVar71._30_2_ = 0x5398;
  auVar15._8_2_ = 0x60f0;
  auVar15._0_8_ = 0x60f060f060f060f0;
  auVar15._10_2_ = 0x60f0;
  auVar15._12_2_ = 0x60f0;
  auVar15._14_2_ = 0x60f0;
  auVar15._16_2_ = 0x60f0;
  auVar15._18_2_ = 0x60f0;
  auVar15._20_2_ = 0x60f0;
  auVar15._22_2_ = 0x60f0;
  auVar15._24_2_ = 0x60f0;
  auVar15._26_2_ = 0x60f0;
  auVar15._28_2_ = 0x60f0;
  auVar15._30_2_ = 0x60f0;
  auVar14 = vpmulhrsw_avx2((undefined1  [32])input[0x1d],auVar71);
  auVar15 = vpmulhrsw_avx2((undefined1  [32])input[0x1d],auVar15);
  auVar4._8_2_ = 0xf698;
  auVar4._0_8_ = 0xf698f698f698f698;
  auVar4._10_2_ = 0xf698;
  auVar4._12_2_ = 0xf698;
  auVar4._14_2_ = 0xf698;
  auVar4._16_2_ = 0xf698;
  auVar4._18_2_ = 0xf698;
  auVar4._20_2_ = 0xf698;
  auVar4._22_2_ = 0xf698;
  auVar4._24_2_ = 0xf698;
  auVar4._26_2_ = 0xf698;
  auVar4._28_2_ = 0xf698;
  auVar4._30_2_ = 0xf698;
  auVar16._8_2_ = 0x7fa8;
  auVar16._0_8_ = 0x7fa87fa87fa87fa8;
  auVar16._10_2_ = 0x7fa8;
  auVar16._12_2_ = 0x7fa8;
  auVar16._14_2_ = 0x7fa8;
  auVar16._16_2_ = 0x7fa8;
  auVar16._18_2_ = 0x7fa8;
  auVar16._20_2_ = 0x7fa8;
  auVar16._22_2_ = 0x7fa8;
  auVar16._24_2_ = 0x7fa8;
  auVar16._26_2_ = 0x7fa8;
  auVar16._28_2_ = 0x7fa8;
  auVar16._30_2_ = 0x7fa8;
  auVar63 = vpmulhrsw_avx2((undefined1  [32])input[3],auVar4);
  auVar16 = vpmulhrsw_avx2((undefined1  [32])input[3],auVar16);
  auVar5._8_2_ = 0x648;
  auVar5._0_8_ = 0x648064806480648;
  auVar5._10_2_ = 0x648;
  auVar5._12_2_ = 0x648;
  auVar5._14_2_ = 0x648;
  auVar5._16_2_ = 0x648;
  auVar5._18_2_ = 0x648;
  auVar5._20_2_ = 0x648;
  auVar5._22_2_ = 0x648;
  auVar5._24_2_ = 0x648;
  auVar5._26_2_ = 0x648;
  auVar5._28_2_ = 0x648;
  auVar5._30_2_ = 0x648;
  auVar17._8_2_ = 0x7fd8;
  auVar17._0_8_ = 0x7fd87fd87fd87fd8;
  auVar17._10_2_ = 0x7fd8;
  auVar17._12_2_ = 0x7fd8;
  auVar17._14_2_ = 0x7fd8;
  auVar17._16_2_ = 0x7fd8;
  auVar17._18_2_ = 0x7fd8;
  auVar17._20_2_ = 0x7fd8;
  auVar17._22_2_ = 0x7fd8;
  auVar17._24_2_ = 0x7fd8;
  auVar17._26_2_ = 0x7fd8;
  auVar17._28_2_ = 0x7fd8;
  auVar17._30_2_ = 0x7fd8;
  auVar68 = vpmulhrsw_avx2((undefined1  [32])input[2],auVar5);
  auVar25 = vpmulhrsw_avx2((undefined1  [32])input[2],auVar17);
  auVar6._8_2_ = 0xaa08;
  auVar6._0_8_ = 0xaa08aa08aa08aa08;
  auVar6._10_2_ = 0xaa08;
  auVar6._12_2_ = 0xaa08;
  auVar6._14_2_ = 0xaa08;
  auVar6._16_2_ = 0xaa08;
  auVar6._18_2_ = 0xaa08;
  auVar6._20_2_ = 0xaa08;
  auVar6._22_2_ = 0xaa08;
  auVar6._24_2_ = 0xaa08;
  auVar6._26_2_ = 0xaa08;
  auVar6._28_2_ = 0xaa08;
  auVar6._30_2_ = 0xaa08;
  auVar18._8_2_ = 0x5ed8;
  auVar18._0_8_ = 0x5ed85ed85ed85ed8;
  auVar18._10_2_ = 0x5ed8;
  auVar18._12_2_ = 0x5ed8;
  auVar18._14_2_ = 0x5ed8;
  auVar18._16_2_ = 0x5ed8;
  auVar18._18_2_ = 0x5ed8;
  auVar18._20_2_ = 0x5ed8;
  auVar18._22_2_ = 0x5ed8;
  auVar18._24_2_ = 0x5ed8;
  auVar18._26_2_ = 0x5ed8;
  auVar18._28_2_ = 0x5ed8;
  auVar18._30_2_ = 0x5ed8;
  auVar17 = vpmulhrsw_avx2((undefined1  [32])input[0x1e],auVar6);
  auVar26 = vpmulhrsw_avx2((undefined1  [32])input[0x1e],auVar18);
  auVar7._8_2_ = 0x36b8;
  auVar7._0_8_ = 0x36b836b836b836b8;
  auVar7._10_2_ = 0x36b8;
  auVar7._12_2_ = 0x36b8;
  auVar7._14_2_ = 0x36b8;
  auVar7._16_2_ = 0x36b8;
  auVar7._18_2_ = 0x36b8;
  auVar7._20_2_ = 0x36b8;
  auVar7._22_2_ = 0x36b8;
  auVar7._24_2_ = 0x36b8;
  auVar7._26_2_ = 0x36b8;
  auVar7._28_2_ = 0x36b8;
  auVar7._30_2_ = 0x36b8;
  auVar19._8_2_ = 0x73b8;
  auVar19._0_8_ = 0x73b873b873b873b8;
  auVar19._10_2_ = 0x73b8;
  auVar19._12_2_ = 0x73b8;
  auVar19._14_2_ = 0x73b8;
  auVar19._16_2_ = 0x73b8;
  auVar19._18_2_ = 0x73b8;
  auVar19._20_2_ = 0x73b8;
  auVar19._22_2_ = 0x73b8;
  auVar19._24_2_ = 0x73b8;
  auVar19._26_2_ = 0x73b8;
  auVar19._28_2_ = 0x73b8;
  auVar19._30_2_ = 0x73b8;
  auVar18 = vpmulhrsw_avx2((undefined1  [32])input[0x12],auVar7);
  auVar42 = vpmulhrsw_avx2((undefined1  [32])input[0x12],auVar19);
  auVar8._8_2_ = 0xd4e0;
  auVar8._0_8_ = 0xd4e0d4e0d4e0d4e0;
  auVar8._10_2_ = 0xd4e0;
  auVar8._12_2_ = 0xd4e0;
  auVar8._14_2_ = 0xd4e0;
  auVar8._16_2_ = 0xd4e0;
  auVar8._18_2_ = 0xd4e0;
  auVar8._20_2_ = 0xd4e0;
  auVar8._22_2_ = 0xd4e0;
  auVar8._24_2_ = 0xd4e0;
  auVar8._26_2_ = 0xd4e0;
  auVar8._28_2_ = 0xd4e0;
  auVar8._30_2_ = 0xd4e0;
  auVar20._8_2_ = 0x7888;
  auVar20._0_8_ = 0x7888788878887888;
  auVar20._10_2_ = 0x7888;
  auVar20._12_2_ = 0x7888;
  auVar20._14_2_ = 0x7888;
  auVar20._16_2_ = 0x7888;
  auVar20._18_2_ = 0x7888;
  auVar20._20_2_ = 0x7888;
  auVar20._22_2_ = 0x7888;
  auVar20._24_2_ = 0x7888;
  auVar20._26_2_ = 0x7888;
  auVar20._28_2_ = 0x7888;
  auVar20._30_2_ = 0x7888;
  auVar19 = vpmulhrsw_avx2((undefined1  [32])input[0xe],auVar8);
  auVar39 = vpmulhrsw_avx2((undefined1  [32])input[0xe],auVar20);
  auVar9._8_2_ = 0x1f18;
  auVar9._0_8_ = 0x1f181f181f181f18;
  auVar9._10_2_ = 0x1f18;
  auVar9._12_2_ = 0x1f18;
  auVar9._14_2_ = 0x1f18;
  auVar9._16_2_ = 0x1f18;
  auVar9._18_2_ = 0x1f18;
  auVar9._20_2_ = 0x1f18;
  auVar9._22_2_ = 0x1f18;
  auVar9._24_2_ = 0x1f18;
  auVar9._26_2_ = 0x1f18;
  auVar9._28_2_ = 0x1f18;
  auVar9._30_2_ = 0x1f18;
  auVar21._8_2_ = 0x7c28;
  auVar21._0_8_ = 0x7c287c287c287c28;
  auVar21._10_2_ = 0x7c28;
  auVar21._12_2_ = 0x7c28;
  auVar21._14_2_ = 0x7c28;
  auVar21._16_2_ = 0x7c28;
  auVar21._18_2_ = 0x7c28;
  auVar21._20_2_ = 0x7c28;
  auVar21._22_2_ = 0x7c28;
  auVar21._24_2_ = 0x7c28;
  auVar21._26_2_ = 0x7c28;
  auVar21._28_2_ = 0x7c28;
  auVar21._30_2_ = 0x7c28;
  auVar20 = vpmulhrsw_avx2((undefined1  [32])input[10],auVar9);
  auVar21 = vpmulhrsw_avx2((undefined1  [32])input[10],auVar21);
  auVar10._8_2_ = 0xbe30;
  auVar10._0_8_ = 0xbe30be30be30be30;
  auVar10._10_2_ = 0xbe30;
  auVar10._12_2_ = 0xbe30;
  auVar10._14_2_ = 0xbe30;
  auVar10._16_2_ = 0xbe30;
  auVar10._18_2_ = 0xbe30;
  auVar10._20_2_ = 0xbe30;
  auVar10._22_2_ = 0xbe30;
  auVar10._24_2_ = 0xbe30;
  auVar10._26_2_ = 0xbe30;
  auVar10._28_2_ = 0xbe30;
  auVar10._30_2_ = 0xbe30;
  auVar22._8_2_ = 0x6dc8;
  auVar22._0_8_ = 0x6dc86dc86dc86dc8;
  auVar22._10_2_ = 0x6dc8;
  auVar22._12_2_ = 0x6dc8;
  auVar22._14_2_ = 0x6dc8;
  auVar22._16_2_ = 0x6dc8;
  auVar22._18_2_ = 0x6dc8;
  auVar22._20_2_ = 0x6dc8;
  auVar22._22_2_ = 0x6dc8;
  auVar22._24_2_ = 0x6dc8;
  auVar22._26_2_ = 0x6dc8;
  auVar22._28_2_ = 0x6dc8;
  auVar22._30_2_ = 0x6dc8;
  auVar40 = vpmulhrsw_avx2((undefined1  [32])input[0x16],auVar10);
  auVar22 = vpmulhrsw_avx2((undefined1  [32])input[0x16],auVar22);
  auVar11._8_2_ = 0x4c40;
  auVar11._0_8_ = 0x4c404c404c404c40;
  auVar11._10_2_ = 0x4c40;
  auVar11._12_2_ = 0x4c40;
  auVar11._14_2_ = 0x4c40;
  auVar11._16_2_ = 0x4c40;
  auVar11._18_2_ = 0x4c40;
  auVar11._20_2_ = 0x4c40;
  auVar11._22_2_ = 0x4c40;
  auVar11._24_2_ = 0x4c40;
  auVar11._26_2_ = 0x4c40;
  auVar11._28_2_ = 0x4c40;
  auVar11._30_2_ = 0x4c40;
  auVar23._8_2_ = 0x66d0;
  auVar23._0_8_ = 0x66d066d066d066d0;
  auVar23._10_2_ = 0x66d0;
  auVar23._12_2_ = 0x66d0;
  auVar23._14_2_ = 0x66d0;
  auVar23._16_2_ = 0x66d0;
  auVar23._18_2_ = 0x66d0;
  auVar23._20_2_ = 0x66d0;
  auVar23._22_2_ = 0x66d0;
  auVar23._24_2_ = 0x66d0;
  auVar23._26_2_ = 0x66d0;
  auVar23._28_2_ = 0x66d0;
  auVar23._30_2_ = 0x66d0;
  auVar72 = vpmulhrsw_avx2((undefined1  [32])input[0x1a],auVar11);
  auVar23 = vpmulhrsw_avx2((undefined1  [32])input[0x1a],auVar23);
  auVar28._8_2_ = 0xed38;
  auVar28._0_8_ = 0xed38ed38ed38ed38;
  auVar28._10_2_ = 0xed38;
  auVar28._12_2_ = 0xed38;
  auVar28._14_2_ = 0xed38;
  auVar28._16_2_ = 0xed38;
  auVar28._18_2_ = 0xed38;
  auVar28._20_2_ = 0xed38;
  auVar28._22_2_ = 0xed38;
  auVar28._24_2_ = 0xed38;
  auVar28._26_2_ = 0xed38;
  auVar28._28_2_ = 0xed38;
  auVar28._30_2_ = 0xed38;
  auVar24._8_2_ = 0x7ea0;
  auVar24._0_8_ = 0x7ea07ea07ea07ea0;
  auVar24._10_2_ = 0x7ea0;
  auVar24._12_2_ = 0x7ea0;
  auVar24._14_2_ = 0x7ea0;
  auVar24._16_2_ = 0x7ea0;
  auVar24._18_2_ = 0x7ea0;
  auVar24._20_2_ = 0x7ea0;
  auVar24._22_2_ = 0x7ea0;
  auVar24._24_2_ = 0x7ea0;
  auVar24._26_2_ = 0x7ea0;
  auVar24._28_2_ = 0x7ea0;
  auVar24._30_2_ = 0x7ea0;
  auVar28 = vpmulhrsw_avx2((undefined1  [32])input[6],auVar28);
  auVar24 = vpmulhrsw_avx2((undefined1  [32])input[6],auVar24);
  auVar82 = vpaddsw_avx2(auVar29,auVar45);
  auVar29 = vpsubsw_avx2(auVar29,auVar45);
  auVar71 = vpaddsw_avx2(auVar33,auVar32);
  auVar32 = vpsubsw_avx2(auVar33,auVar32);
  auVar4 = vpaddsw_avx2(auVar34,auVar35);
  auVar33 = vpsubsw_avx2(auVar34,auVar35);
  auVar5 = vpaddsw_avx2(auVar37,auVar36);
  auVar34 = vpsubsw_avx2(auVar37,auVar36);
  auVar6 = vpaddsw_avx2(auVar38,auVar69);
  auVar35 = vpsubsw_avx2(auVar38,auVar69);
  auVar7 = vpaddsw_avx2(auVar73,auVar70);
  auVar36 = vpsubsw_avx2(auVar73,auVar70);
  auVar8 = vpaddsw_avx2(auVar77,auVar13);
  auVar37 = vpsubsw_avx2(auVar77,auVar13);
  auVar13 = vpaddsw_avx2(auVar14,auVar63);
  auVar38 = vpsubsw_avx2(auVar63,auVar14);
  auVar14 = vpaddsw_avx2(auVar16,auVar15);
  auVar58 = vpsubsw_avx2(auVar16,auVar15);
  auVar15 = vpaddsw_avx2(auVar43,auVar62);
  auVar48 = vpsubsw_avx2(auVar43,auVar62);
  auVar43 = vpaddsw_avx2(auVar88,auVar81);
  auVar55 = vpsubsw_avx2(auVar88,auVar81);
  auVar62 = vpaddsw_avx2(auVar66,auVar76);
  auVar66 = vpsubsw_avx2(auVar66,auVar76);
  auVar63 = vpaddsw_avx2(auVar59,auVar65);
  auVar65 = vpsubsw_avx2(auVar59,auVar65);
  auVar16 = vpaddsw_avx2(auVar64,auVar56);
  auVar64 = vpsubsw_avx2(auVar64,auVar56);
  auVar9 = vpaddsw_avx2(auVar50,auVar31);
  auVar31 = vpsubsw_avx2(auVar50,auVar31);
  auVar10 = vpaddsw_avx2(auVar51,auVar30);
  auVar30 = vpsubsw_avx2(auVar30,auVar51);
  auVar83._8_2_ = 0xc88;
  auVar83._0_8_ = 0xc880c880c880c88;
  auVar83._10_2_ = 0xc88;
  auVar83._12_2_ = 0xc88;
  auVar83._14_2_ = 0xc88;
  auVar83._16_2_ = 0xc88;
  auVar83._18_2_ = 0xc88;
  auVar83._20_2_ = 0xc88;
  auVar83._22_2_ = 0xc88;
  auVar83._24_2_ = 0xc88;
  auVar83._26_2_ = 0xc88;
  auVar83._28_2_ = 0xc88;
  auVar83._30_2_ = 0xc88;
  auVar90._8_2_ = 0x7f60;
  auVar90._0_8_ = 0x7f607f607f607f60;
  auVar90._10_2_ = 0x7f60;
  auVar90._12_2_ = 0x7f60;
  auVar90._14_2_ = 0x7f60;
  auVar90._16_2_ = 0x7f60;
  auVar90._18_2_ = 0x7f60;
  auVar90._20_2_ = 0x7f60;
  auVar90._22_2_ = 0x7f60;
  auVar90._24_2_ = 0x7f60;
  auVar90._26_2_ = 0x7f60;
  auVar90._28_2_ = 0x7f60;
  auVar90._30_2_ = 0x7f60;
  auVar69 = vpmulhrsw_avx2((undefined1  [32])input[4],auVar83);
  auVar76 = vpmulhrsw_avx2((undefined1  [32])input[4],auVar90);
  auVar45._8_2_ = 0xaed0;
  auVar45._0_8_ = 0xaed0aed0aed0aed0;
  auVar45._10_2_ = 0xaed0;
  auVar45._12_2_ = 0xaed0;
  auVar45._14_2_ = 0xaed0;
  auVar45._16_2_ = 0xaed0;
  auVar45._18_2_ = 0xaed0;
  auVar45._20_2_ = 0xaed0;
  auVar45._22_2_ = 0xaed0;
  auVar45._24_2_ = 0xaed0;
  auVar45._26_2_ = 0xaed0;
  auVar45._28_2_ = 0xaed0;
  auVar45._30_2_ = 0xaed0;
  auVar84._8_2_ = 0x62f0;
  auVar84._0_8_ = 0x62f062f062f062f0;
  auVar84._10_2_ = 0x62f0;
  auVar84._12_2_ = 0x62f0;
  auVar84._14_2_ = 0x62f0;
  auVar84._16_2_ = 0x62f0;
  auVar84._18_2_ = 0x62f0;
  auVar84._20_2_ = 0x62f0;
  auVar84._22_2_ = 0x62f0;
  auVar84._24_2_ = 0x62f0;
  auVar84._26_2_ = 0x62f0;
  auVar84._28_2_ = 0x62f0;
  auVar84._30_2_ = 0x62f0;
  auVar70 = vpmulhrsw_avx2((undefined1  [32])input[0x1c],auVar45);
  auVar81 = vpmulhrsw_avx2((undefined1  [32])input[0x1c],auVar84);
  auVar51._8_2_ = 0x3c58;
  auVar51._0_8_ = 0x3c583c583c583c58;
  auVar51._10_2_ = 0x3c58;
  auVar51._12_2_ = 0x3c58;
  auVar51._14_2_ = 0x3c58;
  auVar51._16_2_ = 0x3c58;
  auVar51._18_2_ = 0x3c58;
  auVar51._20_2_ = 0x3c58;
  auVar51._22_2_ = 0x3c58;
  auVar51._24_2_ = 0x3c58;
  auVar51._26_2_ = 0x3c58;
  auVar51._28_2_ = 0x3c58;
  auVar51._30_2_ = 0x3c58;
  auVar85._8_2_ = 0x70e0;
  auVar85._0_8_ = 0x70e070e070e070e0;
  auVar85._10_2_ = 0x70e0;
  auVar85._12_2_ = 0x70e0;
  auVar85._14_2_ = 0x70e0;
  auVar85._16_2_ = 0x70e0;
  auVar85._18_2_ = 0x70e0;
  auVar85._20_2_ = 0x70e0;
  auVar85._22_2_ = 0x70e0;
  auVar85._24_2_ = 0x70e0;
  auVar85._26_2_ = 0x70e0;
  auVar85._28_2_ = 0x70e0;
  auVar85._30_2_ = 0x70e0;
  auVar73 = vpmulhrsw_avx2((undefined1  [32])input[0x14],auVar51);
  auVar88 = vpmulhrsw_avx2((undefined1  [32])input[0x14],auVar85);
  auVar50._8_2_ = 0xdad8;
  auVar50._0_8_ = 0xdad8dad8dad8dad8;
  auVar50._10_2_ = 0xdad8;
  auVar50._12_2_ = 0xdad8;
  auVar50._14_2_ = 0xdad8;
  auVar50._16_2_ = 0xdad8;
  auVar50._18_2_ = 0xdad8;
  auVar50._20_2_ = 0xdad8;
  auVar50._22_2_ = 0xdad8;
  auVar50._24_2_ = 0xdad8;
  auVar50._26_2_ = 0xdad8;
  auVar50._28_2_ = 0xdad8;
  auVar50._30_2_ = 0xdad8;
  auVar86._8_2_ = 0x7a80;
  auVar86._0_8_ = 0x7a807a807a807a80;
  auVar86._10_2_ = 0x7a80;
  auVar86._12_2_ = 0x7a80;
  auVar86._14_2_ = 0x7a80;
  auVar86._16_2_ = 0x7a80;
  auVar86._18_2_ = 0x7a80;
  auVar86._20_2_ = 0x7a80;
  auVar86._22_2_ = 0x7a80;
  auVar86._24_2_ = 0x7a80;
  auVar86._26_2_ = 0x7a80;
  auVar86._28_2_ = 0x7a80;
  auVar86._30_2_ = 0x7a80;
  auVar77 = vpmulhrsw_avx2((undefined1  [32])input[0xc],auVar50);
  auVar75 = vpmulhrsw_avx2((undefined1  [32])input[0xc],auVar86);
  auVar11 = vpaddsw_avx2(auVar68,auVar17);
  auVar83 = vpsubsw_avx2(auVar68,auVar17);
  auVar68 = vpaddsw_avx2(auVar19,auVar18);
  auVar84 = vpsubsw_avx2(auVar19,auVar18);
  auVar17 = vpaddsw_avx2(auVar20,auVar40);
  auVar85 = vpsubsw_avx2(auVar20,auVar40);
  auVar18 = vpaddsw_avx2(auVar28,auVar72);
  auVar72 = vpsubsw_avx2(auVar28,auVar72);
  auVar19 = vpaddsw_avx2(auVar24,auVar23);
  auVar23 = vpsubsw_avx2(auVar24,auVar23);
  auVar20 = vpaddsw_avx2(auVar21,auVar22);
  auVar22 = vpsubsw_avx2(auVar21,auVar22);
  auVar21 = vpaddsw_avx2(auVar39,auVar42);
  auVar86 = vpsubsw_avx2(auVar39,auVar42);
  auVar42 = vpaddsw_avx2(auVar25,auVar26);
  auVar90 = vpsubsw_avx2(auVar25,auVar26);
  auVar45 = vpunpcklwd_avx2(auVar29,auVar30);
  auVar30 = vpunpckhwd_avx2(auVar29,auVar30);
  auVar56._8_4_ = 0x191f014;
  auVar56._0_8_ = 0x191f0140191f014;
  auVar56._12_4_ = 0x191f014;
  auVar56._16_4_ = 0x191f014;
  auVar56._20_4_ = 0x191f014;
  auVar56._24_4_ = 0x191f014;
  auVar56._28_4_ = 0x191f014;
  auVar44._8_4_ = 0xfec0191;
  auVar44._0_8_ = 0xfec01910fec0191;
  auVar44._12_4_ = 0xfec0191;
  auVar44._16_4_ = 0xfec0191;
  auVar44._20_4_ = 0xfec0191;
  auVar44._24_4_ = 0xfec0191;
  auVar44._28_4_ = 0xfec0191;
  auVar29 = vpmaddwd_avx2(auVar45,auVar56);
  auVar45 = vpmaddwd_avx2(auVar45,auVar44);
  auVar51 = vpmaddwd_avx2(auVar30,auVar44);
  auVar30 = vpmaddwd_avx2(auVar30,auVar56);
  auVar12._8_4_ = 0x800;
  auVar12._0_8_ = 0x80000000800;
  auVar12._12_4_ = 0x800;
  auVar12._16_4_ = 0x800;
  auVar12._20_4_ = 0x800;
  auVar12._24_4_ = 0x800;
  auVar12._28_4_ = 0x800;
  auVar29 = vpaddd_avx2(auVar29,auVar12);
  auVar30 = vpaddd_avx2(auVar30,auVar12);
  auVar50 = vpsrad_avx2(auVar29,0xc);
  auVar29 = vpsrad_avx2(auVar30,0xc);
  auVar29 = vpackssdw_avx2(auVar50,auVar29);
  auVar30 = vpaddd_avx2(auVar45,auVar12);
  auVar45 = vpaddd_avx2(auVar51,auVar12);
  auVar30 = vpsrad_avx2(auVar30,0xc);
  auVar45 = vpsrad_avx2(auVar45,0xc);
  auVar30 = vpackssdw_avx2(auVar30,auVar45);
  auVar50 = vpunpcklwd_avx2(auVar32,auVar31);
  auVar31 = vpunpckhwd_avx2(auVar32,auVar31);
  auVar32._8_4_ = 0xf014fe6f;
  auVar32._0_8_ = 0xf014fe6ff014fe6f;
  auVar32._12_4_ = 0xf014fe6f;
  auVar32._16_4_ = 0xf014fe6f;
  auVar32._20_4_ = 0xf014fe6f;
  auVar32._24_4_ = 0xf014fe6f;
  auVar32._28_4_ = 0xf014fe6f;
  auVar45 = vpmaddwd_avx2(auVar50,auVar32);
  auVar51 = vpmaddwd_avx2(auVar31,auVar32);
  auVar32 = vpmaddwd_avx2(auVar50,auVar56);
  auVar31 = vpmaddwd_avx2(auVar31,auVar56);
  auVar45 = vpaddd_avx2(auVar45,auVar12);
  auVar51 = vpaddd_avx2(auVar51,auVar12);
  auVar45 = vpsrad_avx2(auVar45,0xc);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar45 = vpackssdw_avx2(auVar45,auVar51);
  auVar51 = vpaddd_avx2(auVar32,auVar12);
  auVar32 = vpaddd_avx2(auVar31,auVar12);
  auVar31 = vpsrad_avx2(auVar51,0xc);
  auVar51 = vpsrad_avx2(auVar32,0xc);
  auVar51 = vpackssdw_avx2(auVar31,auVar51);
  auVar50 = vpunpcklwd_avx2(auVar33,auVar64);
  auVar31 = vpunpckhwd_avx2(auVar33,auVar64);
  auVar46._8_4_ = 0xc5ef5da;
  auVar46._0_8_ = 0xc5ef5da0c5ef5da;
  auVar46._12_4_ = 0xc5ef5da;
  auVar46._16_4_ = 0xc5ef5da;
  auVar46._20_4_ = 0xc5ef5da;
  auVar46._24_4_ = 0xc5ef5da;
  auVar46._28_4_ = 0xc5ef5da;
  auVar52._8_4_ = 0xa260c5e;
  auVar52._0_8_ = 0xa260c5e0a260c5e;
  auVar52._12_4_ = 0xa260c5e;
  auVar52._16_4_ = 0xa260c5e;
  auVar52._20_4_ = 0xa260c5e;
  auVar52._24_4_ = 0xa260c5e;
  auVar52._28_4_ = 0xa260c5e;
  auVar32 = vpmaddwd_avx2(auVar50,auVar46);
  auVar33 = vpmaddwd_avx2(auVar50,auVar52);
  auVar50 = vpmaddwd_avx2(auVar31,auVar52);
  auVar31 = vpmaddwd_avx2(auVar31,auVar46);
  auVar32 = vpaddd_avx2(auVar32,auVar12);
  auVar31 = vpaddd_avx2(auVar31,auVar12);
  auVar64 = vpsrad_avx2(auVar32,0xc);
  auVar32 = vpsrad_avx2(auVar31,0xc);
  auVar32 = vpackssdw_avx2(auVar64,auVar32);
  auVar31 = vpaddd_avx2(auVar33,auVar12);
  auVar33 = vpaddd_avx2(auVar50,auVar12);
  auVar31 = vpsrad_avx2(auVar31,0xc);
  auVar33 = vpsrad_avx2(auVar33,0xc);
  auVar31 = vpackssdw_avx2(auVar31,auVar33);
  auVar56 = vpunpcklwd_avx2(auVar34,auVar65);
  auVar64 = vpunpckhwd_avx2(auVar34,auVar65);
  auVar53._8_4_ = 0xf5daf3a2;
  auVar53._0_8_ = 0xf5daf3a2f5daf3a2;
  auVar53._12_4_ = 0xf5daf3a2;
  auVar53._16_4_ = 0xf5daf3a2;
  auVar53._20_4_ = 0xf5daf3a2;
  auVar53._24_4_ = 0xf5daf3a2;
  auVar53._28_4_ = 0xf5daf3a2;
  auVar33 = vpmaddwd_avx2(auVar56,auVar53);
  auVar50 = vpmaddwd_avx2(auVar64,auVar53);
  auVar34 = vpmaddwd_avx2(auVar56,auVar46);
  auVar64 = vpmaddwd_avx2(auVar64,auVar46);
  auVar33 = vpaddd_avx2(auVar33,auVar12);
  auVar50 = vpaddd_avx2(auVar50,auVar12);
  auVar33 = vpsrad_avx2(auVar33,0xc);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar33 = vpackssdw_avx2(auVar33,auVar50);
  auVar50 = vpaddd_avx2(auVar34,auVar12);
  auVar34 = vpaddd_avx2(auVar64,auVar12);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar34 = vpsrad_avx2(auVar34,0xc);
  auVar50 = vpackssdw_avx2(auVar50,auVar34);
  auVar56 = vpunpcklwd_avx2(auVar35,auVar66);
  auVar64 = vpunpckhwd_avx2(auVar35,auVar66);
  auVar47._8_4_ = 0x78bf1e4;
  auVar47._0_8_ = 0x78bf1e4078bf1e4;
  auVar47._12_4_ = 0x78bf1e4;
  auVar47._16_4_ = 0x78bf1e4;
  auVar47._20_4_ = 0x78bf1e4;
  auVar47._24_4_ = 0x78bf1e4;
  auVar47._28_4_ = 0x78bf1e4;
  auVar54._8_4_ = 0xe1c078b;
  auVar54._0_8_ = 0xe1c078b0e1c078b;
  auVar54._12_4_ = 0xe1c078b;
  auVar54._16_4_ = 0xe1c078b;
  auVar54._20_4_ = 0xe1c078b;
  auVar54._24_4_ = 0xe1c078b;
  auVar54._28_4_ = 0xe1c078b;
  auVar34 = vpmaddwd_avx2(auVar56,auVar47);
  auVar35 = vpmaddwd_avx2(auVar56,auVar54);
  auVar56 = vpmaddwd_avx2(auVar64,auVar54);
  auVar64 = vpmaddwd_avx2(auVar64,auVar47);
  auVar34 = vpaddd_avx2(auVar34,auVar12);
  auVar64 = vpaddd_avx2(auVar64,auVar12);
  auVar65 = vpsrad_avx2(auVar34,0xc);
  auVar34 = vpsrad_avx2(auVar64,0xc);
  auVar34 = vpackssdw_avx2(auVar65,auVar34);
  auVar64 = vpaddd_avx2(auVar35,auVar12);
  auVar35 = vpaddd_avx2(auVar56,auVar12);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar35 = vpsrad_avx2(auVar35,0xc);
  auVar64 = vpackssdw_avx2(auVar64,auVar35);
  auVar59 = vpunpcklwd_avx2(auVar36,auVar55);
  auVar65 = vpunpckhwd_avx2(auVar36,auVar55);
  auVar55._8_4_ = 0xf1e4f875;
  auVar55._0_8_ = 0xf1e4f875f1e4f875;
  auVar55._12_4_ = 0xf1e4f875;
  auVar55._16_4_ = 0xf1e4f875;
  auVar55._20_4_ = 0xf1e4f875;
  auVar55._24_4_ = 0xf1e4f875;
  auVar55._28_4_ = 0xf1e4f875;
  auVar35 = vpmaddwd_avx2(auVar59,auVar55);
  auVar56 = vpmaddwd_avx2(auVar65,auVar55);
  auVar36 = vpmaddwd_avx2(auVar59,auVar47);
  auVar65 = vpmaddwd_avx2(auVar65,auVar47);
  auVar35 = vpaddd_avx2(auVar35,auVar12);
  auVar56 = vpaddd_avx2(auVar56,auVar12);
  auVar35 = vpsrad_avx2(auVar35,0xc);
  auVar56 = vpsrad_avx2(auVar56,0xc);
  auVar35 = vpackssdw_avx2(auVar35,auVar56);
  auVar56 = vpaddd_avx2(auVar36,auVar12);
  auVar36 = vpaddd_avx2(auVar65,auVar12);
  auVar56 = vpsrad_avx2(auVar56,0xc);
  auVar36 = vpsrad_avx2(auVar36,0xc);
  auVar56 = vpackssdw_avx2(auVar56,auVar36);
  auVar59 = vpunpcklwd_avx2(auVar37,auVar48);
  auVar65 = vpunpckhwd_avx2(auVar37,auVar48);
  auVar48._8_4_ = 0xf50fb5b;
  auVar48._0_8_ = 0xf50fb5b0f50fb5b;
  auVar48._12_4_ = 0xf50fb5b;
  auVar48._16_4_ = 0xf50fb5b;
  auVar48._20_4_ = 0xf50fb5b;
  auVar48._24_4_ = 0xf50fb5b;
  auVar48._28_4_ = 0xf50fb5b;
  auVar57._8_4_ = 0x4a50f50;
  auVar57._0_8_ = 0x4a50f5004a50f50;
  auVar57._12_4_ = 0x4a50f50;
  auVar57._16_4_ = 0x4a50f50;
  auVar57._20_4_ = 0x4a50f50;
  auVar57._24_4_ = 0x4a50f50;
  auVar57._28_4_ = 0x4a50f50;
  auVar36 = vpmaddwd_avx2(auVar59,auVar48);
  auVar37 = vpmaddwd_avx2(auVar59,auVar57);
  auVar59 = vpmaddwd_avx2(auVar65,auVar57);
  auVar65 = vpmaddwd_avx2(auVar65,auVar48);
  auVar36 = vpaddd_avx2(auVar36,auVar12);
  auVar65 = vpaddd_avx2(auVar65,auVar12);
  auVar66 = vpsrad_avx2(auVar36,0xc);
  auVar36 = vpsrad_avx2(auVar65,0xc);
  auVar36 = vpackssdw_avx2(auVar66,auVar36);
  auVar65 = vpaddd_avx2(auVar37,auVar12);
  auVar37 = vpaddd_avx2(auVar59,auVar12);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar37 = vpsrad_avx2(auVar37,0xc);
  auVar65 = vpackssdw_avx2(auVar65,auVar37);
  auVar25 = vpunpcklwd_avx2(auVar38,auVar58);
  auVar66 = vpunpckhwd_avx2(auVar38,auVar58);
  auVar58._8_4_ = 0xfb5bf0b0;
  auVar58._0_8_ = 0xfb5bf0b0fb5bf0b0;
  auVar58._12_4_ = 0xfb5bf0b0;
  auVar58._16_4_ = 0xfb5bf0b0;
  auVar58._20_4_ = 0xfb5bf0b0;
  auVar58._24_4_ = 0xfb5bf0b0;
  auVar58._28_4_ = 0xfb5bf0b0;
  auVar37 = vpmaddwd_avx2(auVar25,auVar58);
  auVar59 = vpmaddwd_avx2(auVar66,auVar58);
  auVar38 = vpmaddwd_avx2(auVar25,auVar48);
  auVar66 = vpmaddwd_avx2(auVar66,auVar48);
  auVar37 = vpaddd_avx2(auVar37,auVar12);
  auVar59 = vpaddd_avx2(auVar59,auVar12);
  auVar37 = vpsrad_avx2(auVar37,0xc);
  auVar59 = vpsrad_avx2(auVar59,0xc);
  auVar37 = vpackssdw_avx2(auVar37,auVar59);
  auVar59 = vpaddd_avx2(auVar38,auVar12);
  auVar38 = vpaddd_avx2(auVar66,auVar12);
  auVar59 = vpsrad_avx2(auVar59,0xc);
  auVar38 = vpsrad_avx2(auVar38,0xc);
  auVar59 = vpackssdw_avx2(auVar59,auVar38);
  auVar25._8_2_ = 0x18f8;
  auVar25._0_8_ = 0x18f818f818f818f8;
  auVar25._10_2_ = 0x18f8;
  auVar25._12_2_ = 0x18f8;
  auVar25._14_2_ = 0x18f8;
  auVar25._16_2_ = 0x18f8;
  auVar25._18_2_ = 0x18f8;
  auVar25._20_2_ = 0x18f8;
  auVar25._22_2_ = 0x18f8;
  auVar25._24_2_ = 0x18f8;
  auVar25._26_2_ = 0x18f8;
  auVar25._28_2_ = 0x18f8;
  auVar25._30_2_ = 0x18f8;
  auVar39._8_2_ = 0x7d88;
  auVar39._0_8_ = 0x7d887d887d887d88;
  auVar39._10_2_ = 0x7d88;
  auVar39._12_2_ = 0x7d88;
  auVar39._14_2_ = 0x7d88;
  auVar39._16_2_ = 0x7d88;
  auVar39._18_2_ = 0x7d88;
  auVar39._20_2_ = 0x7d88;
  auVar39._22_2_ = 0x7d88;
  auVar39._24_2_ = 0x7d88;
  auVar39._26_2_ = 0x7d88;
  auVar39._28_2_ = 0x7d88;
  auVar39._30_2_ = 0x7d88;
  auVar28 = vpmulhrsw_avx2((undefined1  [32])input[8],auVar25);
  auVar24 = vpmulhrsw_avx2((undefined1  [32])input[8],auVar39);
  auVar26._8_2_ = 0xb8e0;
  auVar26._0_8_ = 0xb8e0b8e0b8e0b8e0;
  auVar26._10_2_ = 0xb8e0;
  auVar26._12_2_ = 0xb8e0;
  auVar26._14_2_ = 0xb8e0;
  auVar26._16_2_ = 0xb8e0;
  auVar26._18_2_ = 0xb8e0;
  auVar26._20_2_ = 0xb8e0;
  auVar26._22_2_ = 0xb8e0;
  auVar26._24_2_ = 0xb8e0;
  auVar26._26_2_ = 0xb8e0;
  auVar26._28_2_ = 0xb8e0;
  auVar26._30_2_ = 0xb8e0;
  auVar40._8_2_ = 0x6a70;
  auVar40._0_8_ = 0x6a706a706a706a70;
  auVar40._10_2_ = 0x6a70;
  auVar40._12_2_ = 0x6a70;
  auVar40._14_2_ = 0x6a70;
  auVar40._16_2_ = 0x6a70;
  auVar40._18_2_ = 0x6a70;
  auVar40._20_2_ = 0x6a70;
  auVar40._22_2_ = 0x6a70;
  auVar40._24_2_ = 0x6a70;
  auVar40._26_2_ = 0x6a70;
  auVar40._28_2_ = 0x6a70;
  auVar40._30_2_ = 0x6a70;
  auVar58 = vpmulhrsw_avx2((undefined1  [32])input[0x18],auVar26);
  auVar48 = vpmulhrsw_avx2((undefined1  [32])input[0x18],auVar40);
  auVar25 = vpaddsw_avx2(auVar69,auVar70);
  auVar55 = vpsubsw_avx2(auVar69,auVar70);
  auVar26 = vpaddsw_avx2(auVar77,auVar73);
  auVar44 = vpsubsw_avx2(auVar77,auVar73);
  auVar39 = vpaddsw_avx2(auVar75,auVar88);
  auVar75 = vpsubsw_avx2(auVar75,auVar88);
  auVar40 = vpaddsw_avx2(auVar76,auVar81);
  auVar46 = vpsubsw_avx2(auVar76,auVar81);
  auVar76 = vpunpcklwd_avx2(auVar83,auVar90);
  auVar69 = vpunpckhwd_avx2(auVar83,auVar90);
  auVar67._8_4_ = 0x31ff04f;
  auVar67._0_8_ = 0x31ff04f031ff04f;
  auVar67._12_4_ = 0x31ff04f;
  auVar67._16_4_ = 0x31ff04f;
  auVar67._20_4_ = 0x31ff04f;
  auVar67._24_4_ = 0x31ff04f;
  auVar67._28_4_ = 0x31ff04f;
  auVar38 = vpmaddwd_avx2(auVar76,auVar67);
  auVar38 = vpaddd_avx2(auVar38,auVar12);
  auVar66 = vpmaddwd_avx2(auVar69,auVar67);
  auVar66 = vpaddd_avx2(auVar66,auVar12);
  auVar38 = vpsrad_avx2(auVar38,0xc);
  auVar66 = vpsrad_avx2(auVar66,0xc);
  auVar38 = vpackssdw_avx2(auVar38,auVar66);
  auVar60._8_4_ = 0xfb1031f;
  auVar60._0_8_ = 0xfb1031f0fb1031f;
  auVar60._12_4_ = 0xfb1031f;
  auVar60._16_4_ = 0xfb1031f;
  auVar60._20_4_ = 0xfb1031f;
  auVar60._24_4_ = 0xfb1031f;
  auVar60._28_4_ = 0xfb1031f;
  auVar66 = vpmaddwd_avx2(auVar76,auVar60);
  auVar69 = vpmaddwd_avx2(auVar69,auVar60);
  auVar66 = vpaddd_avx2(auVar66,auVar12);
  auVar69 = vpaddd_avx2(auVar69,auVar12);
  auVar66 = vpsrad_avx2(auVar66,0xc);
  auVar69 = vpsrad_avx2(auVar69,0xc);
  auVar66 = vpackssdw_avx2(auVar66,auVar69);
  auVar81 = vpunpcklwd_avx2(auVar84,auVar86);
  auVar70 = vpunpckhwd_avx2(auVar84,auVar86);
  auVar27._8_4_ = 0xf04ffce1;
  auVar27._0_8_ = 0xf04ffce1f04ffce1;
  auVar27._12_4_ = 0xf04ffce1;
  auVar27._16_4_ = 0xf04ffce1;
  auVar27._20_4_ = 0xf04ffce1;
  auVar27._24_4_ = 0xf04ffce1;
  auVar27._28_4_ = 0xf04ffce1;
  auVar69 = vpmaddwd_avx2(auVar81,auVar27);
  auVar69 = vpaddd_avx2(auVar69,auVar12);
  auVar76 = vpmaddwd_avx2(auVar70,auVar27);
  auVar76 = vpaddd_avx2(auVar76,auVar12);
  auVar69 = vpsrad_avx2(auVar69,0xc);
  auVar76 = vpsrad_avx2(auVar76,0xc);
  auVar69 = vpackssdw_avx2(auVar69,auVar76);
  auVar76 = vpmaddwd_avx2(auVar81,auVar67);
  auVar70 = vpmaddwd_avx2(auVar70,auVar67);
  auVar76 = vpaddd_avx2(auVar76,auVar12);
  auVar70 = vpaddd_avx2(auVar70,auVar12);
  auVar76 = vpsrad_avx2(auVar76,0xc);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar76 = vpackssdw_avx2(auVar76,auVar70);
  auVar88 = vpunpcklwd_avx2(auVar85,auVar22);
  auVar73 = vpunpckhwd_avx2(auVar85,auVar22);
  auVar41._8_4_ = 0xd4ef71c;
  auVar41._0_8_ = 0xd4ef71c0d4ef71c;
  auVar41._12_4_ = 0xd4ef71c;
  auVar41._16_4_ = 0xd4ef71c;
  auVar41._20_4_ = 0xd4ef71c;
  auVar41._24_4_ = 0xd4ef71c;
  auVar41._28_4_ = 0xd4ef71c;
  auVar70 = vpmaddwd_avx2(auVar88,auVar41);
  auVar70 = vpaddd_avx2(auVar70,auVar12);
  auVar81 = vpmaddwd_avx2(auVar73,auVar41);
  auVar81 = vpaddd_avx2(auVar81,auVar12);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar81 = vpsrad_avx2(auVar81,0xc);
  auVar70 = vpackssdw_avx2(auVar70,auVar81);
  auVar89._8_4_ = 0x8e40d4e;
  auVar89._0_8_ = 0x8e40d4e08e40d4e;
  auVar89._12_4_ = 0x8e40d4e;
  auVar89._16_4_ = 0x8e40d4e;
  auVar89._20_4_ = 0x8e40d4e;
  auVar89._24_4_ = 0x8e40d4e;
  auVar89._28_4_ = 0x8e40d4e;
  auVar81 = vpmaddwd_avx2(auVar89,auVar88);
  auVar73 = vpmaddwd_avx2(auVar89,auVar73);
  auVar81 = vpaddd_avx2(auVar81,auVar12);
  auVar73 = vpaddd_avx2(auVar73,auVar12);
  auVar81 = vpsrad_avx2(auVar81,0xc);
  auVar73 = vpsrad_avx2(auVar73,0xc);
  auVar81 = vpackssdw_avx2(auVar81,auVar73);
  auVar22 = vpunpcklwd_avx2(auVar72,auVar23);
  auVar77 = vpunpckhwd_avx2(auVar72,auVar23);
  auVar74._8_4_ = 0xf71cf2b2;
  auVar74._0_8_ = 0xf71cf2b2f71cf2b2;
  auVar74._12_4_ = 0xf71cf2b2;
  auVar74._16_4_ = 0xf71cf2b2;
  auVar74._20_4_ = 0xf71cf2b2;
  auVar74._24_4_ = 0xf71cf2b2;
  auVar74._28_4_ = 0xf71cf2b2;
  auVar73 = vpmaddwd_avx2(auVar22,auVar74);
  auVar73 = vpaddd_avx2(auVar73,auVar12);
  auVar88 = vpmaddwd_avx2(auVar77,auVar74);
  auVar88 = vpaddd_avx2(auVar88,auVar12);
  auVar73 = vpsrad_avx2(auVar73,0xc);
  auVar88 = vpsrad_avx2(auVar88,0xc);
  auVar73 = vpackssdw_avx2(auVar73,auVar88);
  auVar88 = vpmaddwd_avx2(auVar22,auVar41);
  auVar77 = vpmaddwd_avx2(auVar77,auVar41);
  auVar88 = vpaddd_avx2(auVar88,auVar12);
  auVar77 = vpaddd_avx2(auVar77,auVar12);
  auVar88 = vpsrad_avx2(auVar88,0xc);
  auVar77 = vpsrad_avx2(auVar77,0xc);
  auVar88 = vpackssdw_avx2(auVar88,auVar77);
  auVar22 = vpaddsw_avx2(auVar82,auVar71);
  auVar71 = vpsubsw_avx2(auVar82,auVar71);
  auVar72 = vpaddsw_avx2(auVar45,auVar29);
  auVar83 = vpsubsw_avx2(auVar29,auVar45);
  auVar23 = vpaddsw_avx2(auVar5,auVar4);
  auVar84 = vpsubsw_avx2(auVar5,auVar4);
  auVar4 = vpaddsw_avx2(auVar33,auVar32);
  auVar85 = vpsubsw_avx2(auVar33,auVar32);
  auVar5 = vpaddsw_avx2(auVar6,auVar7);
  auVar86 = vpsubsw_avx2(auVar6,auVar7);
  auVar6 = vpaddsw_avx2(auVar35,auVar34);
  auVar90 = vpsubsw_avx2(auVar34,auVar35);
  auVar7 = vpaddsw_avx2(auVar13,auVar8);
  auVar47 = vpsubsw_avx2(auVar13,auVar8);
  auVar8 = vpaddsw_avx2(auVar37,auVar36);
  auVar52 = vpsubsw_avx2(auVar37,auVar36);
  auVar13 = vpaddsw_avx2(auVar14,auVar15);
  auVar53 = vpsubsw_avx2(auVar14,auVar15);
  auVar14 = vpaddsw_avx2(auVar59,auVar65);
  auVar54 = vpsubsw_avx2(auVar59,auVar65);
  auVar15 = vpaddsw_avx2(auVar62,auVar43);
  auVar59 = vpsubsw_avx2(auVar62,auVar43);
  auVar43 = vpaddsw_avx2(auVar64,auVar56);
  auVar37 = vpsubsw_avx2(auVar64,auVar56);
  auVar62 = vpaddsw_avx2(auVar63,auVar16);
  auVar35 = vpsubsw_avx2(auVar63,auVar16);
  auVar63 = vpaddsw_avx2(auVar50,auVar31);
  auVar56 = vpsubsw_avx2(auVar50,auVar31);
  auVar16 = vpaddsw_avx2(auVar10,auVar9);
  auVar50 = vpsubsw_avx2(auVar10,auVar9);
  auVar9 = vpaddsw_avx2(auVar30,auVar51);
  auVar31 = vpsubsw_avx2(auVar30,auVar51);
  auVar29._8_2_ = 0x30f8;
  auVar29._0_8_ = 0x30f830f830f830f8;
  auVar29._10_2_ = 0x30f8;
  auVar29._12_2_ = 0x30f8;
  auVar29._14_2_ = 0x30f8;
  auVar29._16_2_ = 0x30f8;
  auVar29._18_2_ = 0x30f8;
  auVar29._20_2_ = 0x30f8;
  auVar29._22_2_ = 0x30f8;
  auVar29._24_2_ = 0x30f8;
  auVar29._26_2_ = 0x30f8;
  auVar29._28_2_ = 0x30f8;
  auVar29._30_2_ = 0x30f8;
  auVar78._8_2_ = 0x7640;
  auVar78._0_8_ = 0x7640764076407640;
  auVar78._10_2_ = 0x7640;
  auVar78._12_2_ = 0x7640;
  auVar78._14_2_ = 0x7640;
  auVar78._16_2_ = 0x7640;
  auVar78._18_2_ = 0x7640;
  auVar78._20_2_ = 0x7640;
  auVar78._22_2_ = 0x7640;
  auVar78._24_2_ = 0x7640;
  auVar78._26_2_ = 0x7640;
  auVar78._28_2_ = 0x7640;
  auVar78._30_2_ = 0x7640;
  auVar77 = vpmulhrsw_avx2((undefined1  [32])input[0x10],auVar29);
  auVar82 = vpmulhrsw_avx2((undefined1  [32])input[0x10],auVar78);
  auVar10 = vpaddsw_avx2(auVar58,auVar28);
  auVar58 = vpsubsw_avx2(auVar28,auVar58);
  auVar28 = vpaddsw_avx2(auVar48,auVar24);
  auVar48 = vpsubsw_avx2(auVar24,auVar48);
  auVar51 = vpunpcklwd_avx2(auVar55,auVar46);
  auVar45 = vpunpckhwd_avx2(auVar55,auVar46);
  auVar49._8_4_ = 0x61ff138;
  auVar49._0_8_ = 0x61ff138061ff138;
  auVar49._12_4_ = 0x61ff138;
  auVar49._16_4_ = 0x61ff138;
  auVar49._20_4_ = 0x61ff138;
  auVar49._24_4_ = 0x61ff138;
  auVar49._28_4_ = 0x61ff138;
  auVar29 = vpmaddwd_avx2(auVar51,auVar49);
  auVar29 = vpaddd_avx2(auVar29,auVar12);
  auVar30 = vpmaddwd_avx2(auVar45,auVar49);
  auVar30 = vpaddd_avx2(auVar30,auVar12);
  auVar29 = vpsrad_avx2(auVar29,0xc);
  auVar30 = vpsrad_avx2(auVar30,0xc);
  auVar29 = vpackssdw_avx2(auVar29,auVar30);
  auVar80._8_4_ = 0xec8061f;
  auVar80._0_8_ = 0xec8061f0ec8061f;
  auVar80._12_4_ = 0xec8061f;
  auVar80._16_4_ = 0xec8061f;
  auVar80._20_4_ = 0xec8061f;
  auVar80._24_4_ = 0xec8061f;
  auVar80._28_4_ = 0xec8061f;
  auVar30 = vpmaddwd_avx2(auVar80,auVar51);
  auVar45 = vpmaddwd_avx2(auVar45,auVar80);
  auVar30 = vpaddd_avx2(auVar30,auVar12);
  auVar45 = vpaddd_avx2(auVar45,auVar12);
  auVar30 = vpsrad_avx2(auVar30,0xc);
  auVar45 = vpsrad_avx2(auVar45,0xc);
  auVar30 = vpackssdw_avx2(auVar30,auVar45);
  auVar33 = vpunpcklwd_avx2(auVar44,auVar75);
  auVar32 = vpunpckhwd_avx2(auVar44,auVar75);
  auVar87._8_4_ = 0xf138f9e1;
  auVar87._0_8_ = 0xf138f9e1f138f9e1;
  auVar87._12_4_ = 0xf138f9e1;
  auVar87._16_4_ = 0xf138f9e1;
  auVar87._20_4_ = 0xf138f9e1;
  auVar87._24_4_ = 0xf138f9e1;
  auVar87._28_4_ = 0xf138f9e1;
  auVar45 = vpmaddwd_avx2(auVar87,auVar33);
  auVar45 = vpaddd_avx2(auVar45,auVar12);
  auVar51 = vpmaddwd_avx2(auVar32,auVar87);
  auVar51 = vpaddd_avx2(auVar51,auVar12);
  auVar34 = vpsrad_avx2(auVar45,0xc);
  auVar45 = vpsrad_avx2(auVar51,0xc);
  auVar45 = vpackssdw_avx2(auVar34,auVar45);
  auVar51 = vpmaddwd_avx2(auVar33,auVar49);
  auVar32 = vpmaddwd_avx2(auVar32,auVar49);
  auVar51 = vpaddd_avx2(auVar51,auVar12);
  auVar32 = vpaddd_avx2(auVar32,auVar12);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar32 = vpsrad_avx2(auVar32,0xc);
  auVar51 = vpackssdw_avx2(auVar51,auVar32);
  auVar24 = vpaddsw_avx2(auVar68,auVar11);
  auVar55 = vpsubsw_avx2(auVar11,auVar68);
  auVar11 = vpaddsw_avx2(auVar38,auVar69);
  auVar44 = vpsubsw_avx2(auVar38,auVar69);
  auVar68 = vpaddsw_avx2(auVar18,auVar17);
  auVar46 = vpsubsw_avx2(auVar18,auVar17);
  auVar17 = vpaddsw_avx2(auVar73,auVar70);
  auVar57 = vpsubsw_avx2(auVar73,auVar70);
  auVar18 = vpaddsw_avx2(auVar20,auVar19);
  auVar78 = vpsubsw_avx2(auVar19,auVar20);
  auVar19 = vpaddsw_avx2(auVar88,auVar81);
  auVar2 = vpsubsw_avx2(auVar88,auVar81);
  auVar20 = vpaddsw_avx2(auVar42,auVar21);
  auVar88 = vpsubsw_avx2(auVar42,auVar21);
  auVar21 = vpaddsw_avx2(auVar66,auVar76);
  auVar3 = vpsubsw_avx2(auVar66,auVar76);
  auVar34 = vpunpcklwd_avx2(auVar83,auVar31);
  auVar33 = vpunpckhwd_avx2(auVar83,auVar31);
  auVar32 = vpmaddwd_avx2(auVar34,auVar67);
  auVar32 = vpaddd_avx2(auVar32,auVar12);
  auVar31 = vpmaddwd_avx2(auVar33,auVar67);
  auVar31 = vpaddd_avx2(auVar31,auVar12);
  auVar32 = vpsrad_avx2(auVar32,0xc);
  auVar31 = vpsrad_avx2(auVar31,0xc);
  auVar32 = vpackssdw_avx2(auVar32,auVar31);
  auVar31 = vpmaddwd_avx2(auVar34,auVar60);
  auVar33 = vpmaddwd_avx2(auVar33,auVar60);
  auVar31 = vpaddd_avx2(auVar31,auVar12);
  auVar33 = vpaddd_avx2(auVar33,auVar12);
  auVar31 = vpsrad_avx2(auVar31,0xc);
  auVar33 = vpsrad_avx2(auVar33,0xc);
  auVar31 = vpackssdw_avx2(auVar31,auVar33);
  auVar34 = vpunpcklwd_avx2(auVar71,auVar50);
  auVar50 = vpunpckhwd_avx2(auVar71,auVar50);
  auVar33 = vpmaddwd_avx2(auVar34,auVar67);
  auVar34 = vpmaddwd_avx2(auVar34,auVar60);
  auVar64 = vpmaddwd_avx2(auVar50,auVar60);
  auVar50 = vpmaddwd_avx2(auVar50,auVar67);
  auVar33 = vpaddd_avx2(auVar33,auVar12);
  auVar50 = vpaddd_avx2(auVar50,auVar12);
  auVar36 = vpsrad_avx2(auVar33,0xc);
  auVar33 = vpsrad_avx2(auVar50,0xc);
  auVar33 = vpackssdw_avx2(auVar36,auVar33);
  auVar50 = vpaddd_avx2(auVar34,auVar12);
  auVar34 = vpaddd_avx2(auVar64,auVar12);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar34 = vpsrad_avx2(auVar34,0xc);
  auVar50 = vpackssdw_avx2(auVar50,auVar34);
  auVar36 = vpunpcklwd_avx2(auVar84,auVar35);
  auVar35 = vpunpckhwd_avx2(auVar84,auVar35);
  auVar34 = vpmaddwd_avx2(auVar27,auVar36);
  auVar34 = vpaddd_avx2(auVar34,auVar12);
  auVar64 = vpmaddwd_avx2(auVar27,auVar35);
  auVar64 = vpaddd_avx2(auVar64,auVar12);
  auVar34 = vpsrad_avx2(auVar34,0xc);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar34 = vpackssdw_avx2(auVar34,auVar64);
  auVar64 = vpmaddwd_avx2(auVar36,auVar67);
  auVar35 = vpmaddwd_avx2(auVar35,auVar67);
  auVar64 = vpaddd_avx2(auVar64,auVar12);
  auVar35 = vpaddd_avx2(auVar35,auVar12);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar35 = vpsrad_avx2(auVar35,0xc);
  auVar64 = vpackssdw_avx2(auVar64,auVar35);
  auVar36 = vpunpcklwd_avx2(auVar85,auVar56);
  auVar65 = vpunpckhwd_avx2(auVar85,auVar56);
  auVar35 = vpmaddwd_avx2(auVar27,auVar36);
  auVar56 = vpmaddwd_avx2(auVar27,auVar65);
  auVar36 = vpmaddwd_avx2(auVar36,auVar67);
  auVar65 = vpmaddwd_avx2(auVar65,auVar67);
  auVar35 = vpaddd_avx2(auVar35,auVar12);
  auVar56 = vpaddd_avx2(auVar56,auVar12);
  auVar35 = vpsrad_avx2(auVar35,0xc);
  auVar56 = vpsrad_avx2(auVar56,0xc);
  auVar35 = vpackssdw_avx2(auVar35,auVar56);
  auVar56 = vpaddd_avx2(auVar36,auVar12);
  auVar36 = vpaddd_avx2(auVar65,auVar12);
  auVar56 = vpsrad_avx2(auVar56,0xc);
  auVar36 = vpsrad_avx2(auVar36,0xc);
  auVar56 = vpackssdw_avx2(auVar56,auVar36);
  auVar38 = vpunpcklwd_avx2(auVar90,auVar37);
  auVar37 = vpunpckhwd_avx2(auVar90,auVar37);
  auVar36 = vpmaddwd_avx2(auVar38,auVar41);
  auVar36 = vpaddd_avx2(auVar36,auVar12);
  auVar65 = vpmaddwd_avx2(auVar37,auVar41);
  auVar65 = vpaddd_avx2(auVar65,auVar12);
  auVar36 = vpsrad_avx2(auVar36,0xc);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar36 = vpackssdw_avx2(auVar36,auVar65);
  auVar65 = vpmaddwd_avx2(auVar89,auVar38);
  auVar37 = vpmaddwd_avx2(auVar89,auVar37);
  auVar65 = vpaddd_avx2(auVar65,auVar12);
  auVar37 = vpaddd_avx2(auVar37,auVar12);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar37 = vpsrad_avx2(auVar37,0xc);
  auVar65 = vpackssdw_avx2(auVar65,auVar37);
  auVar38 = vpunpcklwd_avx2(auVar86,auVar59);
  auVar59 = vpunpckhwd_avx2(auVar86,auVar59);
  auVar37 = vpmaddwd_avx2(auVar38,auVar41);
  auVar38 = vpmaddwd_avx2(auVar89,auVar38);
  auVar66 = vpmaddwd_avx2(auVar89,auVar59);
  auVar59 = vpmaddwd_avx2(auVar59,auVar41);
  auVar37 = vpaddd_avx2(auVar37,auVar12);
  auVar59 = vpaddd_avx2(auVar59,auVar12);
  auVar69 = vpsrad_avx2(auVar37,0xc);
  auVar37 = vpsrad_avx2(auVar59,0xc);
  auVar37 = vpackssdw_avx2(auVar69,auVar37);
  auVar59 = vpaddd_avx2(auVar38,auVar12);
  auVar38 = vpaddd_avx2(auVar66,auVar12);
  auVar59 = vpsrad_avx2(auVar59,0xc);
  auVar38 = vpsrad_avx2(auVar38,0xc);
  auVar59 = vpackssdw_avx2(auVar59,auVar38);
  auVar76 = vpunpcklwd_avx2(auVar47,auVar53);
  auVar69 = vpunpckhwd_avx2(auVar47,auVar53);
  auVar38 = vpmaddwd_avx2(auVar76,auVar74);
  auVar38 = vpaddd_avx2(auVar38,auVar12);
  auVar66 = vpmaddwd_avx2(auVar69,auVar74);
  auVar66 = vpaddd_avx2(auVar66,auVar12);
  auVar38 = vpsrad_avx2(auVar38,0xc);
  auVar66 = vpsrad_avx2(auVar66,0xc);
  auVar38 = vpackssdw_avx2(auVar38,auVar66);
  auVar66 = vpmaddwd_avx2(auVar76,auVar41);
  auVar69 = vpmaddwd_avx2(auVar69,auVar41);
  auVar66 = vpaddd_avx2(auVar66,auVar12);
  auVar69 = vpaddd_avx2(auVar69,auVar12);
  auVar66 = vpsrad_avx2(auVar66,0xc);
  auVar69 = vpsrad_avx2(auVar69,0xc);
  auVar66 = vpackssdw_avx2(auVar66,auVar69);
  auVar70 = vpunpcklwd_avx2(auVar52,auVar54);
  auVar81 = vpunpckhwd_avx2(auVar52,auVar54);
  auVar69 = vpmaddwd_avx2(auVar70,auVar74);
  auVar76 = vpmaddwd_avx2(auVar81,auVar74);
  auVar70 = vpmaddwd_avx2(auVar70,auVar41);
  auVar81 = vpmaddwd_avx2(auVar81,auVar41);
  auVar69 = vpaddd_avx2(auVar69,auVar12);
  auVar76 = vpaddd_avx2(auVar76,auVar12);
  auVar69 = vpsrad_avx2(auVar69,0xc);
  auVar76 = vpsrad_avx2(auVar76,0xc);
  auVar69 = vpackssdw_avx2(auVar69,auVar76);
  auVar76 = vpaddd_avx2(auVar70,auVar12);
  auVar70 = vpaddd_avx2(auVar81,auVar12);
  auVar81 = vpsrad_avx2(auVar76,0xc);
  auVar76 = vpsrad_avx2(auVar70,0xc);
  auVar76 = vpackssdw_avx2(auVar81,auVar76);
  auVar42._8_2_ = 0x5a80;
  auVar42._0_8_ = 0x5a805a805a805a80;
  auVar42._10_2_ = 0x5a80;
  auVar42._12_2_ = 0x5a80;
  auVar42._14_2_ = 0x5a80;
  auVar42._16_2_ = 0x5a80;
  auVar42._18_2_ = 0x5a80;
  auVar42._20_2_ = 0x5a80;
  auVar42._22_2_ = 0x5a80;
  auVar42._24_2_ = 0x5a80;
  auVar42._26_2_ = 0x5a80;
  auVar42._28_2_ = 0x5a80;
  auVar42._30_2_ = 0x5a80;
  auVar70 = vpmulhrsw_avx2(auVar42,(undefined1  [32])*input);
  auVar42 = vpaddsw_avx2(auVar70,auVar82);
  auVar83 = vpsubsw_avx2(auVar70,auVar82);
  auVar75 = vpaddsw_avx2(auVar70,auVar77);
  auVar84 = vpsubsw_avx2(auVar70,auVar77);
  auVar77 = vpunpcklwd_avx2(auVar58,auVar48);
  auVar73 = vpunpckhwd_avx2(auVar58,auVar48);
  auVar79._8_4_ = 0xb50f4b0;
  auVar79._0_8_ = 0xb50f4b00b50f4b0;
  auVar79._12_4_ = 0xb50f4b0;
  auVar79._16_4_ = 0xb50f4b0;
  auVar79._20_4_ = 0xb50f4b0;
  auVar79._24_4_ = 0xb50f4b0;
  auVar79._28_4_ = 0xb50f4b0;
  auVar70 = vpmaddwd_avx2(auVar79,auVar77);
  auVar70 = vpaddd_avx2(auVar70,auVar12);
  auVar81 = vpmaddwd_avx2(auVar79,auVar73);
  auVar81 = vpaddd_avx2(auVar81,auVar12);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar81 = vpsrad_avx2(auVar81,0xc);
  auVar70 = vpackssdw_avx2(auVar70,auVar81);
  auVar61._8_4_ = 0xb500b50;
  auVar61._0_8_ = 0xb500b500b500b50;
  auVar61._12_4_ = 0xb500b50;
  auVar61._16_4_ = 0xb500b50;
  auVar61._20_4_ = 0xb500b50;
  auVar61._24_4_ = 0xb500b50;
  auVar61._28_4_ = 0xb500b50;
  auVar81 = vpmaddwd_avx2(auVar77,auVar61);
  auVar73 = vpmaddwd_avx2(auVar73,auVar61);
  auVar81 = vpaddd_avx2(auVar81,auVar12);
  auVar73 = vpaddd_avx2(auVar73,auVar12);
  auVar81 = vpsrad_avx2(auVar81,0xc);
  auVar73 = vpsrad_avx2(auVar73,0xc);
  auVar81 = vpackssdw_avx2(auVar81,auVar73);
  auVar58 = vpaddsw_avx2(auVar25,auVar26);
  auVar48 = vpsubsw_avx2(auVar25,auVar26);
  auVar25 = vpaddsw_avx2(auVar29,auVar45);
  auVar85 = vpsubsw_avx2(auVar29,auVar45);
  auVar26 = vpaddsw_avx2(auVar40,auVar39);
  auVar86 = vpsubsw_avx2(auVar40,auVar39);
  auVar39 = vpaddsw_avx2(auVar30,auVar51);
  auVar90 = vpsubsw_avx2(auVar30,auVar51);
  auVar51 = vpunpcklwd_avx2(auVar44,auVar3);
  auVar45 = vpunpckhwd_avx2(auVar44,auVar3);
  auVar29 = vpmaddwd_avx2(auVar51,auVar49);
  auVar29 = vpaddd_avx2(auVar29,auVar12);
  auVar30 = vpmaddwd_avx2(auVar45,auVar49);
  auVar30 = vpaddd_avx2(auVar30,auVar12);
  auVar29 = vpsrad_avx2(auVar29,0xc);
  auVar30 = vpsrad_avx2(auVar30,0xc);
  auVar29 = vpackssdw_avx2(auVar29,auVar30);
  auVar30 = vpmaddwd_avx2(auVar80,auVar51);
  auVar45 = vpmaddwd_avx2(auVar80,auVar45);
  auVar30 = vpaddd_avx2(auVar30,auVar12);
  auVar45 = vpaddd_avx2(auVar45,auVar12);
  auVar30 = vpsrad_avx2(auVar30,0xc);
  auVar45 = vpsrad_avx2(auVar45,0xc);
  auVar30 = vpackssdw_avx2(auVar30,auVar45);
  auVar77 = vpunpcklwd_avx2(auVar55,auVar88);
  auVar73 = vpunpckhwd_avx2(auVar55,auVar88);
  auVar45 = vpmaddwd_avx2(auVar77,auVar49);
  auVar45 = vpaddd_avx2(auVar45,auVar12);
  auVar51 = vpmaddwd_avx2(auVar73,auVar49);
  auVar51 = vpaddd_avx2(auVar51,auVar12);
  auVar45 = vpsrad_avx2(auVar45,0xc);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar45 = vpackssdw_avx2(auVar45,auVar51);
  auVar51 = vpmaddwd_avx2(auVar80,auVar77);
  auVar73 = vpmaddwd_avx2(auVar80,auVar73);
  auVar51 = vpaddd_avx2(auVar51,auVar12);
  auVar73 = vpaddd_avx2(auVar73,auVar12);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar73 = vpsrad_avx2(auVar73,0xc);
  auVar51 = vpackssdw_avx2(auVar51,auVar73);
  auVar82 = vpunpcklwd_avx2(auVar46,auVar78);
  auVar77 = vpunpckhwd_avx2(auVar46,auVar78);
  auVar73 = vpmaddwd_avx2(auVar87,auVar82);
  auVar73 = vpaddd_avx2(auVar73,auVar12);
  auVar88 = vpmaddwd_avx2(auVar87,auVar77);
  auVar88 = vpaddd_avx2(auVar88,auVar12);
  auVar73 = vpsrad_avx2(auVar73,0xc);
  auVar88 = vpsrad_avx2(auVar88,0xc);
  auVar73 = vpackssdw_avx2(auVar73,auVar88);
  auVar88 = vpmaddwd_avx2(auVar82,auVar49);
  auVar77 = vpmaddwd_avx2(auVar77,auVar49);
  auVar88 = vpaddd_avx2(auVar88,auVar12);
  auVar77 = vpaddd_avx2(auVar77,auVar12);
  auVar88 = vpsrad_avx2(auVar88,0xc);
  auVar77 = vpsrad_avx2(auVar77,0xc);
  auVar88 = vpackssdw_avx2(auVar88,auVar77);
  auVar40 = vpunpcklwd_avx2(auVar57,auVar2);
  auVar71 = vpunpckhwd_avx2(auVar57,auVar2);
  auVar77 = vpmaddwd_avx2(auVar87,auVar40);
  auVar77 = vpaddd_avx2(auVar77,auVar12);
  auVar82 = vpmaddwd_avx2(auVar87,auVar71);
  auVar82 = vpaddd_avx2(auVar82,auVar12);
  auVar77 = vpsrad_avx2(auVar77,0xc);
  auVar82 = vpsrad_avx2(auVar82,0xc);
  auVar77 = vpackssdw_avx2(auVar77,auVar82);
  auVar82 = vpmaddwd_avx2(auVar40,auVar49);
  auVar71 = vpmaddwd_avx2(auVar71,auVar49);
  auVar82 = vpaddd_avx2(auVar82,auVar12);
  auVar71 = vpaddd_avx2(auVar71,auVar12);
  auVar82 = vpsrad_avx2(auVar82,0xc);
  auVar71 = vpsrad_avx2(auVar71,0xc);
  auVar82 = vpackssdw_avx2(auVar82,auVar71);
  auVar71 = vpaddsw_avx2(auVar22,auVar23);
  auVar55 = vpsubsw_avx2(auVar22,auVar23);
  auVar40 = vpaddsw_avx2(auVar72,auVar4);
  auVar44 = vpsubsw_avx2(auVar72,auVar4);
  auVar4 = vpaddsw_avx2(auVar32,auVar35);
  auVar35 = vpsubsw_avx2(auVar32,auVar35);
  auVar22 = vpaddsw_avx2(auVar33,auVar34);
  auVar46 = vpsubsw_avx2(auVar33,auVar34);
  auVar72 = vpaddsw_avx2(auVar7,auVar5);
  auVar47 = vpsubsw_avx2(auVar7,auVar5);
  auVar5 = vpaddsw_avx2(auVar8,auVar6);
  auVar52 = vpsubsw_avx2(auVar8,auVar6);
  auVar6 = vpaddsw_avx2(auVar69,auVar36);
  auVar69 = vpsubsw_avx2(auVar69,auVar36);
  auVar7 = vpaddsw_avx2(auVar38,auVar37);
  auVar53 = vpsubsw_avx2(auVar38,auVar37);
  auVar8 = vpaddsw_avx2(auVar13,auVar15);
  auVar37 = vpsubsw_avx2(auVar13,auVar15);
  auVar13 = vpaddsw_avx2(auVar14,auVar43);
  auVar38 = vpsubsw_avx2(auVar14,auVar43);
  auVar14 = vpaddsw_avx2(auVar76,auVar65);
  auVar76 = vpsubsw_avx2(auVar76,auVar65);
  auVar15 = vpaddsw_avx2(auVar66,auVar59);
  auVar54 = vpsubsw_avx2(auVar66,auVar59);
  auVar43 = vpaddsw_avx2(auVar16,auVar62);
  auVar36 = vpsubsw_avx2(auVar16,auVar62);
  auVar62 = vpaddsw_avx2(auVar9,auVar63);
  auVar65 = vpsubsw_avx2(auVar9,auVar63);
  auVar63 = vpaddsw_avx2(auVar31,auVar56);
  auVar56 = vpsubsw_avx2(auVar31,auVar56);
  auVar16 = vpaddsw_avx2(auVar50,auVar64);
  auVar64 = vpsubsw_avx2(auVar50,auVar64);
  auVar9 = vpaddsw_avx2(auVar42,auVar28);
  auVar57 = vpsubsw_avx2(auVar42,auVar28);
  auVar42 = vpaddsw_avx2(auVar81,auVar75);
  auVar75 = vpsubsw_avx2(auVar75,auVar81);
  auVar81 = vpaddsw_avx2(auVar70,auVar84);
  auVar84 = vpsubsw_avx2(auVar84,auVar70);
  auVar23 = vpaddsw_avx2(auVar83,auVar10);
  auVar83 = vpsubsw_avx2(auVar83,auVar10);
  auVar50 = vpunpcklwd_avx2(auVar85,auVar90);
  auVar33 = vpunpckhwd_avx2(auVar85,auVar90);
  auVar32 = vpmaddwd_avx2(auVar79,auVar50);
  auVar32 = vpaddd_avx2(auVar32,auVar12);
  auVar31 = vpmaddwd_avx2(auVar79,auVar33);
  auVar31 = vpaddd_avx2(auVar31,auVar12);
  auVar34 = vpsrad_avx2(auVar32,0xc);
  auVar32 = vpsrad_avx2(auVar31,0xc);
  auVar32 = vpackssdw_avx2(auVar34,auVar32);
  auVar31 = vpmaddwd_avx2(auVar50,auVar61);
  auVar33 = vpmaddwd_avx2(auVar33,auVar61);
  auVar31 = vpaddd_avx2(auVar31,auVar12);
  auVar33 = vpaddd_avx2(auVar33,auVar12);
  auVar31 = vpsrad_avx2(auVar31,0xc);
  auVar33 = vpsrad_avx2(auVar33,0xc);
  auVar31 = vpackssdw_avx2(auVar31,auVar33);
  auVar59 = vpunpcklwd_avx2(auVar48,auVar86);
  auVar34 = vpunpckhwd_avx2(auVar48,auVar86);
  auVar33 = vpmaddwd_avx2(auVar79,auVar59);
  auVar33 = vpaddd_avx2(auVar33,auVar12);
  auVar50 = vpmaddwd_avx2(auVar79,auVar34);
  auVar50 = vpaddd_avx2(auVar50,auVar12);
  auVar33 = vpsrad_avx2(auVar33,0xc);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar33 = vpackssdw_avx2(auVar33,auVar50);
  auVar50 = vpmaddwd_avx2(auVar59,auVar61);
  auVar34 = vpmaddwd_avx2(auVar34,auVar61);
  auVar50 = vpaddd_avx2(auVar50,auVar12);
  auVar34 = vpaddd_avx2(auVar34,auVar12);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar34 = vpsrad_avx2(auVar34,0xc);
  auVar50 = vpackssdw_avx2(auVar50,auVar34);
  auVar10 = vpaddsw_avx2(auVar24,auVar68);
  auVar24 = vpsubsw_avx2(auVar24,auVar68);
  auVar68 = vpaddsw_avx2(auVar11,auVar17);
  auVar48 = vpsubsw_avx2(auVar11,auVar17);
  auVar11 = vpaddsw_avx2(auVar77,auVar29);
  auVar77 = vpsubsw_avx2(auVar29,auVar77);
  auVar17 = vpaddsw_avx2(auVar73,auVar45);
  auVar85 = vpsubsw_avx2(auVar45,auVar73);
  auVar28 = vpaddsw_avx2(auVar20,auVar18);
  auVar86 = vpsubsw_avx2(auVar20,auVar18);
  auVar18 = vpaddsw_avx2(auVar21,auVar19);
  auVar90 = vpsubsw_avx2(auVar21,auVar19);
  auVar19 = vpaddsw_avx2(auVar82,auVar30);
  auVar78 = vpsubsw_avx2(auVar30,auVar82);
  auVar82 = vpaddsw_avx2(auVar88,auVar51);
  auVar88 = vpsubsw_avx2(auVar51,auVar88);
  auVar51 = vpunpcklwd_avx2(auVar46,auVar64);
  auVar45 = vpunpckhwd_avx2(auVar46,auVar64);
  auVar29 = vpmaddwd_avx2(auVar51,auVar49);
  auVar29 = vpaddd_avx2(auVar29,auVar12);
  auVar30 = vpmaddwd_avx2(auVar45,auVar49);
  auVar30 = vpaddd_avx2(auVar30,auVar12);
  auVar29 = vpsrad_avx2(auVar29,0xc);
  auVar30 = vpsrad_avx2(auVar30,0xc);
  auVar29 = vpackssdw_avx2(auVar29,auVar30);
  auVar30 = vpmaddwd_avx2(auVar80,auVar51);
  auVar45 = vpmaddwd_avx2(auVar80,auVar45);
  auVar30 = vpaddd_avx2(auVar30,auVar12);
  auVar45 = vpaddd_avx2(auVar45,auVar12);
  auVar30 = vpsrad_avx2(auVar30,0xc);
  auVar45 = vpsrad_avx2(auVar45,0xc);
  auVar30 = vpackssdw_avx2(auVar30,auVar45);
  auVar64 = vpunpcklwd_avx2(auVar35,auVar56);
  auVar34 = vpunpckhwd_avx2(auVar35,auVar56);
  auVar45 = vpmaddwd_avx2(auVar64,auVar49);
  auVar45 = vpaddd_avx2(auVar45,auVar12);
  auVar51 = vpmaddwd_avx2(auVar34,auVar49);
  auVar51 = vpaddd_avx2(auVar51,auVar12);
  auVar45 = vpsrad_avx2(auVar45,0xc);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar45 = vpackssdw_avx2(auVar45,auVar51);
  auVar51 = vpmaddwd_avx2(auVar80,auVar64);
  auVar34 = vpmaddwd_avx2(auVar80,auVar34);
  auVar51 = vpaddd_avx2(auVar51,auVar12);
  auVar34 = vpaddd_avx2(auVar34,auVar12);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar34 = vpsrad_avx2(auVar34,0xc);
  auVar51 = vpackssdw_avx2(auVar51,auVar34);
  auVar56 = vpunpcklwd_avx2(auVar44,auVar65);
  auVar35 = vpunpckhwd_avx2(auVar44,auVar65);
  auVar34 = vpmaddwd_avx2(auVar56,auVar49);
  auVar34 = vpaddd_avx2(auVar34,auVar12);
  auVar64 = vpmaddwd_avx2(auVar35,auVar49);
  auVar64 = vpaddd_avx2(auVar64,auVar12);
  auVar34 = vpsrad_avx2(auVar34,0xc);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar34 = vpackssdw_avx2(auVar34,auVar64);
  auVar64 = vpmaddwd_avx2(auVar80,auVar56);
  auVar35 = vpmaddwd_avx2(auVar80,auVar35);
  auVar64 = vpaddd_avx2(auVar64,auVar12);
  auVar35 = vpaddd_avx2(auVar35,auVar12);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar35 = vpsrad_avx2(auVar35,0xc);
  auVar64 = vpackssdw_avx2(auVar64,auVar35);
  auVar65 = vpunpcklwd_avx2(auVar55,auVar36);
  auVar56 = vpunpckhwd_avx2(auVar55,auVar36);
  auVar35 = vpmaddwd_avx2(auVar65,auVar49);
  auVar36 = vpmaddwd_avx2(auVar80,auVar65);
  auVar65 = vpmaddwd_avx2(auVar80,auVar56);
  auVar56 = vpmaddwd_avx2(auVar56,auVar49);
  auVar35 = vpaddd_avx2(auVar35,auVar12);
  auVar56 = vpaddd_avx2(auVar56,auVar12);
  auVar59 = vpsrad_avx2(auVar35,0xc);
  auVar35 = vpsrad_avx2(auVar56,0xc);
  auVar35 = vpackssdw_avx2(auVar59,auVar35);
  auVar56 = vpaddd_avx2(auVar36,auVar12);
  auVar36 = vpaddd_avx2(auVar65,auVar12);
  auVar56 = vpsrad_avx2(auVar56,0xc);
  auVar36 = vpsrad_avx2(auVar36,0xc);
  auVar56 = vpackssdw_avx2(auVar56,auVar36);
  auVar59 = vpunpcklwd_avx2(auVar47,auVar37);
  auVar37 = vpunpckhwd_avx2(auVar47,auVar37);
  auVar36 = vpmaddwd_avx2(auVar87,auVar59);
  auVar36 = vpaddd_avx2(auVar36,auVar12);
  auVar65 = vpmaddwd_avx2(auVar87,auVar37);
  auVar65 = vpaddd_avx2(auVar65,auVar12);
  auVar36 = vpsrad_avx2(auVar36,0xc);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar36 = vpackssdw_avx2(auVar36,auVar65);
  auVar65 = vpmaddwd_avx2(auVar59,auVar49);
  auVar37 = vpmaddwd_avx2(auVar37,auVar49);
  auVar65 = vpaddd_avx2(auVar65,auVar12);
  auVar37 = vpaddd_avx2(auVar37,auVar12);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar37 = vpsrad_avx2(auVar37,0xc);
  auVar65 = vpackssdw_avx2(auVar65,auVar37);
  auVar66 = vpunpcklwd_avx2(auVar52,auVar38);
  auVar38 = vpunpckhwd_avx2(auVar52,auVar38);
  auVar37 = vpmaddwd_avx2(auVar87,auVar66);
  auVar37 = vpaddd_avx2(auVar37,auVar12);
  auVar59 = vpmaddwd_avx2(auVar87,auVar38);
  auVar59 = vpaddd_avx2(auVar59,auVar12);
  auVar37 = vpsrad_avx2(auVar37,0xc);
  auVar59 = vpsrad_avx2(auVar59,0xc);
  auVar37 = vpackssdw_avx2(auVar37,auVar59);
  auVar59 = vpmaddwd_avx2(auVar66,auVar49);
  auVar38 = vpmaddwd_avx2(auVar38,auVar49);
  auVar59 = vpaddd_avx2(auVar59,auVar12);
  auVar38 = vpaddd_avx2(auVar38,auVar12);
  auVar59 = vpsrad_avx2(auVar59,0xc);
  auVar38 = vpsrad_avx2(auVar38,0xc);
  auVar59 = vpackssdw_avx2(auVar59,auVar38);
  auVar70 = vpunpcklwd_avx2(auVar69,auVar76);
  auVar69 = vpunpckhwd_avx2(auVar69,auVar76);
  auVar38 = vpmaddwd_avx2(auVar87,auVar70);
  auVar38 = vpaddd_avx2(auVar38,auVar12);
  auVar66 = vpmaddwd_avx2(auVar87,auVar69);
  auVar66 = vpaddd_avx2(auVar66,auVar12);
  auVar38 = vpsrad_avx2(auVar38,0xc);
  auVar66 = vpsrad_avx2(auVar66,0xc);
  auVar38 = vpackssdw_avx2(auVar38,auVar66);
  auVar66 = vpmaddwd_avx2(auVar70,auVar49);
  auVar69 = vpmaddwd_avx2(auVar69,auVar49);
  auVar66 = vpaddd_avx2(auVar66,auVar12);
  auVar69 = vpaddd_avx2(auVar69,auVar12);
  auVar66 = vpsrad_avx2(auVar66,0xc);
  auVar69 = vpsrad_avx2(auVar69,0xc);
  auVar66 = vpackssdw_avx2(auVar66,auVar69);
  auVar70 = vpunpcklwd_avx2(auVar53,auVar54);
  auVar73 = vpunpckhwd_avx2(auVar53,auVar54);
  auVar69 = vpmaddwd_avx2(auVar87,auVar70);
  auVar76 = vpmaddwd_avx2(auVar87,auVar73);
  auVar70 = vpmaddwd_avx2(auVar70,auVar49);
  auVar73 = vpmaddwd_avx2(auVar73,auVar49);
  auVar69 = vpaddd_avx2(auVar69,auVar12);
  auVar76 = vpaddd_avx2(auVar76,auVar12);
  auVar69 = vpsrad_avx2(auVar69,0xc);
  auVar76 = vpsrad_avx2(auVar76,0xc);
  auVar69 = vpackssdw_avx2(auVar69,auVar76);
  auVar76 = vpaddd_avx2(auVar70,auVar12);
  auVar70 = vpaddd_avx2(auVar73,auVar12);
  auVar73 = vpsrad_avx2(auVar76,0xc);
  auVar76 = vpsrad_avx2(auVar70,0xc);
  auVar76 = vpackssdw_avx2(auVar73,auVar76);
  auVar20 = vpaddsw_avx2(auVar9,auVar26);
  auVar55 = vpsubsw_avx2(auVar9,auVar26);
  auVar9 = vpaddsw_avx2(auVar42,auVar39);
  auVar44 = vpsubsw_avx2(auVar42,auVar39);
  auVar21 = vpaddsw_avx2(auVar81,auVar31);
  auVar46 = vpsubsw_avx2(auVar81,auVar31);
  auVar42 = vpaddsw_avx2(auVar23,auVar50);
  auVar47 = vpsubsw_avx2(auVar23,auVar50);
  auVar26 = vpaddsw_avx2(auVar83,auVar33);
  auVar83 = vpsubsw_avx2(auVar83,auVar33);
  auVar39 = vpaddsw_avx2(auVar84,auVar32);
  auVar84 = vpsubsw_avx2(auVar84,auVar32);
  auVar23 = vpaddsw_avx2(auVar75,auVar25);
  auVar75 = vpsubsw_avx2(auVar75,auVar25);
  auVar25 = vpaddsw_avx2(auVar57,auVar58);
  auVar58 = vpsubsw_avx2(auVar57,auVar58);
  auVar50 = vpunpcklwd_avx2(auVar85,auVar88);
  auVar33 = vpunpckhwd_avx2(auVar85,auVar88);
  auVar32 = vpmaddwd_avx2(auVar79,auVar50);
  auVar32 = vpaddd_avx2(auVar32,auVar12);
  auVar31 = vpmaddwd_avx2(auVar79,auVar33);
  auVar31 = vpaddd_avx2(auVar31,auVar12);
  auVar32 = vpsrad_avx2(auVar32,0xc);
  auVar31 = vpsrad_avx2(auVar31,0xc);
  auVar32 = vpackssdw_avx2(auVar32,auVar31);
  auVar31 = vpmaddwd_avx2(auVar50,auVar61);
  auVar33 = vpmaddwd_avx2(auVar33,auVar61);
  auVar31 = vpaddd_avx2(auVar31,auVar12);
  auVar33 = vpaddd_avx2(auVar33,auVar12);
  auVar31 = vpsrad_avx2(auVar31,0xc);
  auVar33 = vpsrad_avx2(auVar33,0xc);
  auVar31 = vpackssdw_avx2(auVar31,auVar33);
  auVar81 = vpunpcklwd_avx2(auVar77,auVar78);
  auVar70 = vpunpckhwd_avx2(auVar77,auVar78);
  auVar33 = vpmaddwd_avx2(auVar79,auVar81);
  auVar33 = vpaddd_avx2(auVar33,auVar12);
  auVar50 = vpmaddwd_avx2(auVar79,auVar70);
  auVar50 = vpaddd_avx2(auVar50,auVar12);
  auVar33 = vpsrad_avx2(auVar33,0xc);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar33 = vpackssdw_avx2(auVar33,auVar50);
  auVar50 = vpmaddwd_avx2(auVar81,auVar61);
  auVar70 = vpmaddwd_avx2(auVar70,auVar61);
  auVar50 = vpaddd_avx2(auVar50,auVar12);
  auVar70 = vpaddd_avx2(auVar70,auVar12);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar50 = vpackssdw_avx2(auVar50,auVar70);
  auVar88 = vpunpcklwd_avx2(auVar48,auVar90);
  auVar73 = vpunpckhwd_avx2(auVar48,auVar90);
  auVar70 = vpmaddwd_avx2(auVar79,auVar88);
  auVar70 = vpaddd_avx2(auVar70,auVar12);
  auVar81 = vpmaddwd_avx2(auVar79,auVar73);
  auVar81 = vpaddd_avx2(auVar81,auVar12);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar81 = vpsrad_avx2(auVar81,0xc);
  auVar70 = vpackssdw_avx2(auVar70,auVar81);
  auVar81 = vpmaddwd_avx2(auVar88,auVar61);
  auVar73 = vpmaddwd_avx2(auVar73,auVar61);
  auVar81 = vpaddd_avx2(auVar81,auVar12);
  auVar73 = vpaddd_avx2(auVar73,auVar12);
  auVar81 = vpsrad_avx2(auVar81,0xc);
  auVar73 = vpsrad_avx2(auVar73,0xc);
  auVar81 = vpackssdw_avx2(auVar81,auVar73);
  auVar48 = vpunpcklwd_avx2(auVar24,auVar86);
  auVar77 = vpunpckhwd_avx2(auVar24,auVar86);
  auVar73 = vpmaddwd_avx2(auVar79,auVar48);
  auVar73 = vpaddd_avx2(auVar73,auVar12);
  auVar88 = vpmaddwd_avx2(auVar79,auVar77);
  auVar88 = vpaddd_avx2(auVar88,auVar12);
  auVar73 = vpsrad_avx2(auVar73,0xc);
  auVar88 = vpsrad_avx2(auVar88,0xc);
  auVar73 = vpackssdw_avx2(auVar73,auVar88);
  auVar88 = vpmaddwd_avx2(auVar48,auVar61);
  auVar77 = vpmaddwd_avx2(auVar77,auVar61);
  auVar88 = vpaddd_avx2(auVar88,auVar12);
  auVar77 = vpaddd_avx2(auVar77,auVar12);
  auVar88 = vpsrad_avx2(auVar88,0xc);
  auVar77 = vpsrad_avx2(auVar77,0xc);
  auVar88 = vpackssdw_avx2(auVar88,auVar77);
  auVar77 = vpaddsw_avx2(auVar71,auVar72);
  auVar72 = vpsubsw_avx2(auVar71,auVar72);
  auVar71 = vpaddsw_avx2(auVar40,auVar5);
  auVar24 = vpsubsw_avx2(auVar40,auVar5);
  auVar5 = vpaddsw_avx2(auVar4,auVar6);
  auVar48 = vpsubsw_avx2(auVar4,auVar6);
  auVar4 = vpaddsw_avx2(auVar22,auVar7);
  auVar85 = vpsubsw_avx2(auVar22,auVar7);
  auVar6 = vpaddsw_avx2(auVar29,auVar69);
  auVar86 = vpsubsw_avx2(auVar29,auVar69);
  auVar69 = vpaddsw_avx2(auVar45,auVar38);
  auVar38 = vpsubsw_avx2(auVar45,auVar38);
  auVar7 = vpaddsw_avx2(auVar34,auVar37);
  auVar34 = vpsubsw_avx2(auVar34,auVar37);
  auVar40 = vpaddsw_avx2(auVar35,auVar36);
  auVar29 = vpsubsw_avx2(auVar35,auVar36);
  auVar22 = vpaddsw_avx2(auVar43,auVar8);
  auVar90 = vpsubsw_avx2(auVar43,auVar8);
  auVar8 = vpaddsw_avx2(auVar62,auVar13);
  auVar37 = vpsubsw_avx2(auVar62,auVar13);
  auVar13 = vpaddsw_avx2(auVar63,auVar14);
  auVar36 = vpsubsw_avx2(auVar63,auVar14);
  auVar14 = vpaddsw_avx2(auVar16,auVar15);
  auVar35 = vpsubsw_avx2(auVar16,auVar15);
  auVar15 = vpaddsw_avx2(auVar76,auVar30);
  auVar52 = vpsubsw_avx2(auVar30,auVar76);
  auVar76 = vpaddsw_avx2(auVar66,auVar51);
  auVar66 = vpsubsw_avx2(auVar51,auVar66);
  auVar43 = vpaddsw_avx2(auVar59,auVar64);
  auVar51 = vpsubsw_avx2(auVar64,auVar59);
  auVar62 = vpaddsw_avx2(auVar56,auVar65);
  auVar30 = vpsubsw_avx2(auVar56,auVar65);
  auVar63 = vpaddsw_avx2(auVar28,auVar20);
  auVar28 = vpsubsw_avx2(auVar20,auVar28);
  auVar16 = vpaddsw_avx2(auVar18,auVar9);
  auVar53 = vpsubsw_avx2(auVar9,auVar18);
  auVar9 = vpaddsw_avx2(auVar19,auVar21);
  auVar54 = vpsubsw_avx2(auVar21,auVar19);
  auVar18 = vpaddsw_avx2(auVar82,auVar42);
  auVar57 = vpsubsw_avx2(auVar42,auVar82);
  auVar82 = vpaddsw_avx2(auVar31,auVar26);
  auVar26 = vpsubsw_avx2(auVar26,auVar31);
  auVar19 = vpaddsw_avx2(auVar50,auVar39);
  auVar39 = vpsubsw_avx2(auVar39,auVar50);
  auVar20 = vpaddsw_avx2(auVar81,auVar23);
  auVar23 = vpsubsw_avx2(auVar23,auVar81);
  auVar81 = vpaddsw_avx2(auVar25,auVar88);
  auVar25 = vpsubsw_avx2(auVar25,auVar88);
  auVar88 = vpaddsw_avx2(auVar58,auVar73);
  auVar58 = vpsubsw_avx2(auVar58,auVar73);
  auVar73 = vpaddsw_avx2(auVar70,auVar75);
  auVar75 = vpsubsw_avx2(auVar75,auVar70);
  auVar70 = vpaddsw_avx2(auVar84,auVar33);
  auVar84 = vpsubsw_avx2(auVar84,auVar33);
  auVar21 = vpaddsw_avx2(auVar83,auVar32);
  auVar83 = vpsubsw_avx2(auVar83,auVar32);
  auVar42 = vpaddsw_avx2(auVar47,auVar17);
  auVar47 = vpsubsw_avx2(auVar47,auVar17);
  auVar17 = vpaddsw_avx2(auVar46,auVar11);
  auVar46 = vpsubsw_avx2(auVar46,auVar11);
  auVar11 = vpaddsw_avx2(auVar44,auVar68);
  auVar44 = vpsubsw_avx2(auVar44,auVar68);
  auVar68 = vpaddsw_avx2(auVar55,auVar10);
  auVar10 = vpsubsw_avx2(auVar55,auVar10);
  auVar32 = vpunpcklwd_avx2(auVar29,auVar30);
  auVar45 = vpunpckhwd_avx2(auVar29,auVar30);
  auVar29 = vpmaddwd_avx2(auVar79,auVar32);
  auVar29 = vpaddd_avx2(auVar29,auVar12);
  auVar30 = vpmaddwd_avx2(auVar79,auVar45);
  auVar30 = vpaddd_avx2(auVar30,auVar12);
  auVar29 = vpsrad_avx2(auVar29,0xc);
  auVar30 = vpsrad_avx2(auVar30,0xc);
  auVar29 = vpackssdw_avx2(auVar29,auVar30);
  auVar30 = vpmaddwd_avx2(auVar32,auVar61);
  auVar45 = vpmaddwd_avx2(auVar45,auVar61);
  auVar30 = vpaddd_avx2(auVar30,auVar12);
  auVar45 = vpaddd_avx2(auVar45,auVar12);
  auVar32 = vpsrad_avx2(auVar30,0xc);
  auVar30 = vpsrad_avx2(auVar45,0xc);
  auVar30 = vpackssdw_avx2(auVar32,auVar30);
  auVar31 = vpunpcklwd_avx2(auVar34,auVar51);
  auVar32 = vpunpckhwd_avx2(auVar34,auVar51);
  auVar45 = vpmaddwd_avx2(auVar79,auVar31);
  auVar45 = vpaddd_avx2(auVar45,auVar12);
  auVar51 = vpmaddwd_avx2(auVar79,auVar32);
  auVar51 = vpaddd_avx2(auVar51,auVar12);
  auVar45 = vpsrad_avx2(auVar45,0xc);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar45 = vpackssdw_avx2(auVar45,auVar51);
  auVar51 = vpmaddwd_avx2(auVar31,auVar61);
  auVar32 = vpmaddwd_avx2(auVar32,auVar61);
  auVar51 = vpaddd_avx2(auVar51,auVar12);
  auVar32 = vpaddd_avx2(auVar32,auVar12);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar32 = vpsrad_avx2(auVar32,0xc);
  auVar51 = vpackssdw_avx2(auVar51,auVar32);
  auVar50 = vpunpcklwd_avx2(auVar38,auVar66);
  auVar33 = vpunpckhwd_avx2(auVar38,auVar66);
  auVar32 = vpmaddwd_avx2(auVar79,auVar50);
  auVar32 = vpaddd_avx2(auVar32,auVar12);
  auVar31 = vpmaddwd_avx2(auVar79,auVar33);
  auVar31 = vpaddd_avx2(auVar31,auVar12);
  auVar32 = vpsrad_avx2(auVar32,0xc);
  auVar31 = vpsrad_avx2(auVar31,0xc);
  auVar32 = vpackssdw_avx2(auVar32,auVar31);
  auVar31 = vpmaddwd_avx2(auVar50,auVar61);
  auVar33 = vpmaddwd_avx2(auVar33,auVar61);
  auVar31 = vpaddd_avx2(auVar31,auVar12);
  auVar33 = vpaddd_avx2(auVar33,auVar12);
  auVar31 = vpsrad_avx2(auVar31,0xc);
  auVar33 = vpsrad_avx2(auVar33,0xc);
  auVar31 = vpackssdw_avx2(auVar31,auVar33);
  auVar64 = vpunpcklwd_avx2(auVar86,auVar52);
  auVar34 = vpunpckhwd_avx2(auVar86,auVar52);
  auVar33 = vpmaddwd_avx2(auVar79,auVar64);
  auVar33 = vpaddd_avx2(auVar33,auVar12);
  auVar50 = vpmaddwd_avx2(auVar79,auVar34);
  auVar50 = vpaddd_avx2(auVar50,auVar12);
  auVar33 = vpsrad_avx2(auVar33,0xc);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar33 = vpackssdw_avx2(auVar33,auVar50);
  auVar50 = vpmaddwd_avx2(auVar64,auVar61);
  auVar34 = vpmaddwd_avx2(auVar34,auVar61);
  auVar50 = vpaddd_avx2(auVar50,auVar12);
  auVar34 = vpaddd_avx2(auVar34,auVar12);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar34 = vpsrad_avx2(auVar34,0xc);
  auVar50 = vpackssdw_avx2(auVar50,auVar34);
  auVar56 = vpunpcklwd_avx2(auVar85,auVar35);
  auVar35 = vpunpckhwd_avx2(auVar85,auVar35);
  auVar34 = vpmaddwd_avx2(auVar79,auVar56);
  auVar34 = vpaddd_avx2(auVar34,auVar12);
  auVar64 = vpmaddwd_avx2(auVar79,auVar35);
  auVar64 = vpaddd_avx2(auVar64,auVar12);
  auVar34 = vpsrad_avx2(auVar34,0xc);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar34 = vpackssdw_avx2(auVar34,auVar64);
  auVar64 = vpmaddwd_avx2(auVar56,auVar61);
  auVar35 = vpmaddwd_avx2(auVar35,auVar61);
  auVar64 = vpaddd_avx2(auVar64,auVar12);
  auVar35 = vpaddd_avx2(auVar35,auVar12);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar35 = vpsrad_avx2(auVar35,0xc);
  auVar64 = vpackssdw_avx2(auVar64,auVar35);
  auVar65 = vpunpcklwd_avx2(auVar48,auVar36);
  auVar36 = vpunpckhwd_avx2(auVar48,auVar36);
  auVar35 = vpmaddwd_avx2(auVar79,auVar65);
  auVar35 = vpaddd_avx2(auVar35,auVar12);
  auVar56 = vpmaddwd_avx2(auVar79,auVar36);
  auVar56 = vpaddd_avx2(auVar56,auVar12);
  auVar35 = vpsrad_avx2(auVar35,0xc);
  auVar56 = vpsrad_avx2(auVar56,0xc);
  auVar35 = vpackssdw_avx2(auVar35,auVar56);
  auVar56 = vpmaddwd_avx2(auVar65,auVar61);
  auVar36 = vpmaddwd_avx2(auVar36,auVar61);
  auVar56 = vpaddd_avx2(auVar56,auVar12);
  auVar36 = vpaddd_avx2(auVar36,auVar12);
  auVar56 = vpsrad_avx2(auVar56,0xc);
  auVar36 = vpsrad_avx2(auVar36,0xc);
  auVar56 = vpackssdw_avx2(auVar56,auVar36);
  auVar59 = vpunpcklwd_avx2(auVar24,auVar37);
  auVar37 = vpunpckhwd_avx2(auVar24,auVar37);
  auVar36 = vpmaddwd_avx2(auVar79,auVar59);
  auVar36 = vpaddd_avx2(auVar36,auVar12);
  auVar65 = vpmaddwd_avx2(auVar37,auVar79);
  auVar65 = vpaddd_avx2(auVar65,auVar12);
  auVar36 = vpsrad_avx2(auVar36,0xc);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar36 = vpackssdw_avx2(auVar36,auVar65);
  auVar65 = vpmaddwd_avx2(auVar59,auVar61);
  auVar37 = vpmaddwd_avx2(auVar37,auVar61);
  auVar65 = vpaddd_avx2(auVar65,auVar12);
  auVar37 = vpaddd_avx2(auVar37,auVar12);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar37 = vpsrad_avx2(auVar37,0xc);
  auVar65 = vpackssdw_avx2(auVar65,auVar37);
  auVar38 = vpunpcklwd_avx2(auVar72,auVar90);
  auVar66 = vpunpckhwd_avx2(auVar72,auVar90);
  auVar37 = vpmaddwd_avx2(auVar79,auVar38);
  auVar59 = vpmaddwd_avx2(auVar66,auVar79);
  auVar38 = vpmaddwd_avx2(auVar38,auVar61);
  auVar66 = vpmaddwd_avx2(auVar66,auVar61);
  auVar37 = vpaddd_avx2(auVar37,auVar12);
  auVar59 = vpaddd_avx2(auVar59,auVar12);
  auVar38 = vpaddd_avx2(auVar38,auVar12);
  auVar66 = vpaddd_avx2(auVar66,auVar12);
  auVar37 = vpsrad_avx2(auVar37,0xc);
  auVar59 = vpsrad_avx2(auVar59,0xc);
  auVar37 = vpackssdw_avx2(auVar37,auVar59);
  auVar59 = vpsrad_avx2(auVar38,0xc);
  auVar38 = vpsrad_avx2(auVar66,0xc);
  auVar59 = vpackssdw_avx2(auVar59,auVar38);
  alVar1 = (__m256i)vpaddsw_avx2(auVar63,auVar22);
  *output = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar63,auVar22);
  output[0x3f] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar16,auVar8);
  output[1] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar16,auVar8);
  output[0x3e] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar9,auVar13);
  output[2] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar9,auVar13);
  output[0x3d] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar18,auVar14);
  output[3] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar18,auVar14);
  output[0x3c] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar82,auVar15);
  output[4] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar82,auVar15);
  output[0x3b] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar19,auVar76);
  output[5] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar19,auVar76);
  output[0x3a] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar20,auVar43);
  output[6] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar20,auVar43);
  output[0x39] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar81,auVar62);
  output[7] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar81,auVar62);
  output[0x38] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar88,auVar30);
  output[8] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar88,auVar30);
  output[0x37] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar73,auVar51);
  output[9] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar73,auVar51);
  output[0x36] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar70,auVar31);
  output[10] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar70,auVar31);
  output[0x35] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar21,auVar50);
  output[0xb] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar21,auVar50);
  output[0x34] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar64,auVar42);
  output[0xc] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar42,auVar64);
  output[0x33] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar17,auVar56);
  output[0xd] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar17,auVar56);
  output[0x32] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar65,auVar11);
  output[0xe] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar11,auVar65);
  output[0x31] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar68,auVar59);
  output[0xf] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar68,auVar59);
  output[0x30] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar10,auVar37);
  output[0x10] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar10,auVar37);
  output[0x2f] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar44,auVar36);
  output[0x11] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar44,auVar36);
  output[0x2e] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar46,auVar35);
  output[0x12] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar46,auVar35);
  output[0x2d] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar47,auVar34);
  output[0x13] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar47,auVar34);
  output[0x2c] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar33,auVar83);
  output[0x14] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar83,auVar33);
  output[0x2b] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar84,auVar32);
  output[0x15] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar84,auVar32);
  output[0x2a] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar75,auVar45);
  output[0x16] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar75,auVar45);
  output[0x29] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar58,auVar29);
  output[0x17] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar58,auVar29);
  output[0x28] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar25,auVar40);
  output[0x18] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar25,auVar40);
  output[0x27] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar23,auVar7);
  output[0x19] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar23,auVar7);
  output[0x26] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar39,auVar69);
  output[0x1a] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar39,auVar69);
  output[0x25] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar26,auVar6);
  output[0x1b] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar26,auVar6);
  output[0x24] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar57,auVar4);
  output[0x1c] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar57,auVar4);
  output[0x23] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar54,auVar5);
  output[0x1d] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar54,auVar5);
  output[0x22] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar53,auVar71);
  output[0x1e] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar53,auVar71);
  output[0x21] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2(auVar28,auVar77);
  output[0x1f] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2(auVar28,auVar77);
  output[0x20] = alVar1;
  return;
}

Assistant:

static void idct64_low32_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m256i x[64];
  x[0] = input[0];
  x[2] = input[16];
  x[4] = input[8];
  x[6] = input[24];
  x[8] = input[4];
  x[10] = input[20];
  x[12] = input[12];
  x[14] = input[28];
  x[16] = input[2];
  x[18] = input[18];
  x[20] = input[10];
  x[22] = input[26];
  x[24] = input[6];
  x[26] = input[22];
  x[28] = input[14];
  x[30] = input[30];
  x[32] = input[1];
  x[34] = input[17];
  x[36] = input[9];
  x[38] = input[25];
  x[40] = input[5];
  x[42] = input[21];
  x[44] = input[13];
  x[46] = input[29];
  x[48] = input[3];
  x[50] = input[19];
  x[52] = input[11];
  x[54] = input[27];
  x[56] = input[7];
  x[58] = input[23];
  x[60] = input[15];
  x[62] = input[31];

  // stage 2
  btf_16_w16_0_avx2(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_w16_0_avx2(-cospi[33], cospi[31], x[62], x[33], x[62]);
  btf_16_w16_0_avx2(cospi[47], cospi[17], x[34], x[34], x[61]);
  btf_16_w16_0_avx2(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_w16_0_avx2(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_w16_0_avx2(-cospi[41], cospi[23], x[58], x[37], x[58]);
  btf_16_w16_0_avx2(cospi[39], cospi[25], x[38], x[38], x[57]);
  btf_16_w16_0_avx2(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_w16_0_avx2(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_w16_0_avx2(-cospi[37], cospi[27], x[54], x[41], x[54]);
  btf_16_w16_0_avx2(cospi[43], cospi[21], x[42], x[42], x[53]);
  btf_16_w16_0_avx2(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_w16_0_avx2(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_w16_0_avx2(-cospi[45], cospi[19], x[50], x[45], x[50]);
  btf_16_w16_0_avx2(cospi[35], cospi[29], x[46], x[46], x[49]);
  btf_16_w16_0_avx2(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_w16_0_avx2(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_w16_0_avx2(-cospi[34], cospi[30], x[30], x[17], x[30]);
  btf_16_w16_0_avx2(cospi[46], cospi[18], x[18], x[18], x[29]);
  btf_16_w16_0_avx2(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_w16_0_avx2(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_w16_0_avx2(-cospi[42], cospi[22], x[26], x[21], x[26]);
  btf_16_w16_0_avx2(cospi[38], cospi[26], x[22], x[22], x[25]);
  btf_16_w16_0_avx2(-cospi[58], cospi[6], x[24], x[23], x[24]);
  btf_16_adds_subs_avx2(&x[32], &x[33]);
  btf_16_adds_subs_avx2(&x[35], &x[34]);
  btf_16_adds_subs_avx2(&x[36], &x[37]);
  btf_16_adds_subs_avx2(&x[39], &x[38]);
  btf_16_adds_subs_avx2(&x[40], &x[41]);
  btf_16_adds_subs_avx2(&x[43], &x[42]);
  btf_16_adds_subs_avx2(&x[44], &x[45]);
  btf_16_adds_subs_avx2(&x[47], &x[46]);
  btf_16_adds_subs_avx2(&x[48], &x[49]);
  btf_16_adds_subs_avx2(&x[51], &x[50]);
  btf_16_adds_subs_avx2(&x[52], &x[53]);
  btf_16_adds_subs_avx2(&x[55], &x[54]);
  btf_16_adds_subs_avx2(&x[56], &x[57]);
  btf_16_adds_subs_avx2(&x[59], &x[58]);
  btf_16_adds_subs_avx2(&x[60], &x[61]);
  btf_16_adds_subs_avx2(&x[63], &x[62]);

  // stage 4
  btf_16_w16_0_avx2(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_w16_0_avx2(-cospi[36], cospi[28], x[14], x[9], x[14]);
  btf_16_w16_0_avx2(cospi[44], cospi[20], x[10], x[10], x[13]);
  btf_16_w16_0_avx2(-cospi[52], cospi[12], x[12], x[11], x[12]);
  btf_16_adds_subs_avx2(&x[16], &x[17]);
  btf_16_adds_subs_avx2(&x[19], &x[18]);
  btf_16_adds_subs_avx2(&x[20], &x[21]);
  btf_16_adds_subs_avx2(&x[23], &x[22]);
  btf_16_adds_subs_avx2(&x[24], &x[25]);
  btf_16_adds_subs_avx2(&x[27], &x[26]);
  btf_16_adds_subs_avx2(&x[28], &x[29]);
  btf_16_adds_subs_avx2(&x[31], &x[30]);
  idct64_stage4_high32_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_0_avx2(cospi[56], cospi[8], x[4], x[4], x[7]);
  btf_16_w16_0_avx2(-cospi[40], cospi[24], x[6], x[5], x[6]);
  btf_16_adds_subs_avx2(&x[8], &x[9]);
  btf_16_adds_subs_avx2(&x[11], &x[10]);
  btf_16_adds_subs_avx2(&x[12], &x[13]);
  btf_16_adds_subs_avx2(&x[15], &x[14]);
  idct64_stage5_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 6
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_w16_0_avx2(cospi[48], cospi[16], x[2], x[2], x[3]);
  btf_16_adds_subs_avx2(&x[4], &x[5]);
  btf_16_adds_subs_avx2(&x[7], &x[6]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[9], &x[14], _r, INV_COS_BIT);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[10], &x[13], _r,
                  INV_COS_BIT);
  idct64_stage6_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 7
  btf_16_adds_subs_avx2(&x[0], &x[3]);
  btf_16_adds_subs_avx2(&x[1], &x[2]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[5], &x[6], _r, INV_COS_BIT);
  btf_16_adds_subs_avx2(&x[8], &x[11]);
  btf_16_adds_subs_avx2(&x[9], &x[10]);
  btf_16_adds_subs_avx2(&x[15], &x[12]);
  btf_16_adds_subs_avx2(&x[14], &x[13]);
  idct64_stage7_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 8
  btf_16_adds_subs_avx2(&x[0], &x[7]);
  btf_16_adds_subs_avx2(&x[1], &x[6]);
  btf_16_adds_subs_avx2(&x[2], &x[5]);
  btf_16_adds_subs_avx2(&x[3], &x[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[10], &x[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[11], &x[12], _r,
                  INV_COS_BIT);
  idct64_stage8_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 9~11
  idct64_stage9_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage10_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage11_avx2(output, x);
}